

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx::CurveNiIntersector1<8>::
     occluded_n<embree::avx::OrientedCurve1Intersector1<embree::CatmullRomCurveT,7,8>,embree::avx::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  undefined8 *puVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  ulong uVar5;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar6;
  undefined1 auVar7 [16];
  Primitive PVar8;
  Geometry *pGVar9;
  RTCFilterFunctionN p_Var10;
  void *pvVar11;
  __int_type_conflict _Var12;
  long lVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  bool bVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined8 uVar64;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  byte bVar68;
  uint uVar69;
  uint uVar70;
  long lVar72;
  ulong uVar73;
  ulong uVar74;
  ulong uVar75;
  float t1;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  float fVar131;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  float fVar155;
  float fVar156;
  float fVar158;
  float fVar159;
  float fVar160;
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  float fVar157;
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  float fVar161;
  float fVar177;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  float fVar174;
  float fVar176;
  float fVar179;
  float fVar180;
  float fVar181;
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  float fVar175;
  float fVar178;
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  float fVar182;
  float fVar199;
  float fVar200;
  undefined1 auVar183 [16];
  float fVar201;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  float fVar202;
  float fVar203;
  float fVar204;
  undefined1 auVar198 [32];
  float fVar219;
  vfloat4 b0;
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  float fVar221;
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar210 [16];
  undefined1 auVar217 [32];
  float fVar220;
  undefined1 auVar218 [32];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  vfloat4 a0_1;
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  __m128 a;
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  float fVar286;
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  float fVar284;
  float fVar285;
  float fVar287;
  float fVar288;
  float fVar289;
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  float fVar290;
  float fVar295;
  undefined1 auVar291 [16];
  float fVar293;
  float fVar294;
  float fVar296;
  float fVar297;
  float fVar298;
  float fVar299;
  float fVar300;
  float fVar301;
  float in_register_0000151c;
  undefined1 auVar292 [32];
  float fVar302;
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [32];
  float fVar308;
  float fVar309;
  undefined1 auVar307 [32];
  float fVar310;
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  float fVar314;
  float fVar315;
  float in_register_0000159c;
  undefined1 auVar313 [32];
  vfloat4 a0;
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  float in_register_000015dc;
  undefined1 auVar325 [64];
  vfloat_impl<4> p03;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  bool local_4d9;
  undefined1 local_488 [16];
  int local_46c;
  undefined1 local_468 [8];
  float fStack_460;
  float fStack_45c;
  undefined1 auStack_458 [16];
  undefined1 local_448 [8];
  float fStack_440;
  float fStack_43c;
  undefined1 local_428 [8];
  float fStack_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  float fStack_410;
  undefined1 local_408 [8];
  float fStack_400;
  float fStack_3fc;
  ulong local_3f0;
  float local_3e8;
  float fStack_3e4;
  float fStack_3e0;
  float fStack_3dc;
  undefined1 local_3d8 [8];
  float fStack_3d0;
  float fStack_3cc;
  undefined1 auStack_3c8 [16];
  undefined1 local_3b8 [8];
  float fStack_3b0;
  float fStack_3ac;
  undefined1 local_3a8 [8];
  float fStack_3a0;
  float fStack_39c;
  undefined1 local_398 [8];
  float fStack_390;
  float fStack_38c;
  undefined1 local_388 [8];
  float fStack_380;
  float fStack_37c;
  undefined1 local_378 [8];
  float fStack_370;
  float fStack_36c;
  undefined1 local_368 [8];
  float fStack_360;
  float fStack_35c;
  undefined1 local_358 [8];
  float fStack_350;
  float fStack_34c;
  undefined1 local_348 [8];
  float fStack_340;
  float fStack_33c;
  undefined1 local_338 [8];
  float fStack_330;
  float fStack_32c;
  undefined1 local_328 [8];
  float fStack_320;
  float fStack_31c;
  undefined1 auStack_318 [16];
  undefined1 local_308 [8];
  float fStack_300;
  float fStack_2fc;
  undefined1 local_2f8 [8];
  float fStack_2f0;
  float fStack_2ec;
  undefined1 local_2e8 [8];
  float fStack_2e0;
  float fStack_2dc;
  undefined1 local_2d8 [16];
  ulong local_2c8;
  Primitive *local_2c0;
  RTCFilterFunctionNArguments local_2b8;
  undefined1 local_288 [8];
  float fStack_280;
  float fStack_27c;
  uint auStack_278 [4];
  undefined8 local_268;
  undefined4 local_260;
  undefined8 local_25c;
  undefined4 local_254;
  undefined4 local_250;
  uint local_24c;
  uint local_248;
  undefined1 local_238 [8];
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [8];
  float fStack_220;
  float fStack_21c;
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [8];
  float fStack_1e0;
  float fStack_1dc;
  undefined1 local_1d8 [8];
  float fStack_1d0;
  float fStack_1cc;
  undefined1 local_1c8 [8];
  float fStack_1c0;
  float fStack_1bc;
  undefined1 local_1b8 [32];
  float afStack_198 [8];
  undefined1 local_178 [32];
  undefined1 local_158 [32];
  undefined1 local_138 [32];
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar71;
  undefined1 auVar154 [32];
  undefined1 auVar324 [32];
  
  PVar8 = prim[1];
  uVar75 = (ulong)(byte)PVar8;
  lVar72 = uVar75 * 5;
  auVar101 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                        *(undefined1 (*) [16])(prim + uVar75 * 0x19 + 6));
  fVar182 = *(float *)(prim + uVar75 * 0x19 + 0x12);
  auVar93._0_4_ = fVar182 * auVar101._0_4_;
  auVar93._4_4_ = fVar182 * auVar101._4_4_;
  auVar93._8_4_ = fVar182 * auVar101._8_4_;
  auVar93._12_4_ = fVar182 * auVar101._12_4_;
  auVar183._0_4_ = fVar182 * (ray->dir).field_0.m128[0];
  auVar183._4_4_ = fVar182 * (ray->dir).field_0.m128[1];
  auVar183._8_4_ = fVar182 * (ray->dir).field_0.m128[2];
  auVar183._12_4_ = fVar182 * (ray->dir).field_0.m128[3];
  auVar101 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar75 * 4 + 6)));
  auVar240 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar75 * 4 + 10)));
  auVar84._16_16_ = auVar240;
  auVar84._0_16_ = auVar101;
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar101 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar72 + 6)));
  auVar240 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar72 + 10)));
  auVar125._16_16_ = auVar240;
  auVar125._0_16_ = auVar101;
  auVar101 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar75 * 6 + 6)));
  auVar240 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar75 * 6 + 10)));
  auVar14 = vcvtdq2ps_avx(auVar125);
  auVar147._16_16_ = auVar240;
  auVar147._0_16_ = auVar101;
  auVar15 = vcvtdq2ps_avx(auVar147);
  auVar101 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar75 * 0xb + 6)));
  auVar240 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar75 * 0xb + 10)));
  auVar170._16_16_ = auVar240;
  auVar170._0_16_ = auVar101;
  uVar73 = (ulong)((uint)(byte)PVar8 * 0xc);
  auVar101 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 + 6)));
  auVar16 = vcvtdq2ps_avx(auVar170);
  auVar240 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 + 10)));
  auVar215._16_16_ = auVar240;
  auVar215._0_16_ = auVar101;
  auVar17 = vcvtdq2ps_avx(auVar215);
  auVar101 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 + uVar75 + 6)));
  auVar240 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 + uVar75 + 10)));
  auVar231._16_16_ = auVar240;
  auVar231._0_16_ = auVar101;
  auVar18 = vcvtdq2ps_avx(auVar231);
  lVar13 = uVar75 * 9;
  uVar73 = (ulong)(uint)((int)lVar13 * 2);
  auVar101 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 + 6)));
  auVar240 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 + 10)));
  auVar250._16_16_ = auVar240;
  auVar250._0_16_ = auVar101;
  auVar101 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 + uVar75 + 6)));
  auVar240 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 + uVar75 + 10)));
  auVar19 = vcvtdq2ps_avx(auVar250);
  auVar265._16_16_ = auVar240;
  auVar265._0_16_ = auVar101;
  auVar20 = vcvtdq2ps_avx(auVar265);
  uVar73 = (ulong)(uint)((int)lVar72 << 2);
  auVar101 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 + 6)));
  auVar240 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 + 10)));
  auVar272._16_16_ = auVar240;
  auVar272._0_16_ = auVar101;
  auVar21 = vcvtdq2ps_avx(auVar272);
  auVar101 = vshufps_avx(auVar183,auVar183,0);
  auVar240 = vshufps_avx(auVar183,auVar183,0x55);
  auVar22 = vshufps_avx(auVar183,auVar183,0xaa);
  fVar182 = auVar22._0_4_;
  fVar199 = auVar22._4_4_;
  fVar200 = auVar22._8_4_;
  fVar201 = auVar22._12_4_;
  fVar202 = auVar240._0_4_;
  fVar203 = auVar240._4_4_;
  fVar204 = auVar240._8_4_;
  fVar131 = auVar240._12_4_;
  fVar155 = auVar101._0_4_;
  fVar156 = auVar101._4_4_;
  fVar157 = auVar101._8_4_;
  fVar158 = auVar101._12_4_;
  auVar292._0_4_ = fVar155 * auVar84._0_4_ + fVar202 * auVar14._0_4_ + fVar182 * auVar15._0_4_;
  auVar292._4_4_ = fVar156 * auVar84._4_4_ + fVar203 * auVar14._4_4_ + fVar199 * auVar15._4_4_;
  auVar292._8_4_ = fVar157 * auVar84._8_4_ + fVar204 * auVar14._8_4_ + fVar200 * auVar15._8_4_;
  auVar292._12_4_ = fVar158 * auVar84._12_4_ + fVar131 * auVar14._12_4_ + fVar201 * auVar15._12_4_;
  auVar292._16_4_ = fVar155 * auVar84._16_4_ + fVar202 * auVar14._16_4_ + fVar182 * auVar15._16_4_;
  auVar292._20_4_ = fVar156 * auVar84._20_4_ + fVar203 * auVar14._20_4_ + fVar199 * auVar15._20_4_;
  auVar292._24_4_ = fVar157 * auVar84._24_4_ + fVar204 * auVar14._24_4_ + fVar200 * auVar15._24_4_;
  auVar292._28_4_ = fVar131 + in_register_000015dc + in_register_0000151c;
  auVar282._0_4_ = fVar155 * auVar16._0_4_ + fVar202 * auVar17._0_4_ + fVar182 * auVar18._0_4_;
  auVar282._4_4_ = fVar156 * auVar16._4_4_ + fVar203 * auVar17._4_4_ + fVar199 * auVar18._4_4_;
  auVar282._8_4_ = fVar157 * auVar16._8_4_ + fVar204 * auVar17._8_4_ + fVar200 * auVar18._8_4_;
  auVar282._12_4_ = fVar158 * auVar16._12_4_ + fVar131 * auVar17._12_4_ + fVar201 * auVar18._12_4_;
  auVar282._16_4_ = fVar155 * auVar16._16_4_ + fVar202 * auVar17._16_4_ + fVar182 * auVar18._16_4_;
  auVar282._20_4_ = fVar156 * auVar16._20_4_ + fVar203 * auVar17._20_4_ + fVar199 * auVar18._20_4_;
  auVar282._24_4_ = fVar157 * auVar16._24_4_ + fVar204 * auVar17._24_4_ + fVar200 * auVar18._24_4_;
  auVar282._28_4_ = fVar131 + in_register_000015dc + in_register_0000159c;
  auVar198._0_4_ = fVar155 * auVar19._0_4_ + fVar202 * auVar20._0_4_ + auVar21._0_4_ * fVar182;
  auVar198._4_4_ = fVar156 * auVar19._4_4_ + fVar203 * auVar20._4_4_ + auVar21._4_4_ * fVar199;
  auVar198._8_4_ = fVar157 * auVar19._8_4_ + fVar204 * auVar20._8_4_ + auVar21._8_4_ * fVar200;
  auVar198._12_4_ = fVar158 * auVar19._12_4_ + fVar131 * auVar20._12_4_ + auVar21._12_4_ * fVar201;
  auVar198._16_4_ = fVar155 * auVar19._16_4_ + fVar202 * auVar20._16_4_ + auVar21._16_4_ * fVar182;
  auVar198._20_4_ = fVar156 * auVar19._20_4_ + fVar203 * auVar20._20_4_ + auVar21._20_4_ * fVar199;
  auVar198._24_4_ = fVar157 * auVar19._24_4_ + fVar204 * auVar20._24_4_ + auVar21._24_4_ * fVar200;
  auVar198._28_4_ = fVar158 + fVar131 + fVar201;
  auVar101 = vshufps_avx(auVar93,auVar93,0);
  auVar240 = vshufps_avx(auVar93,auVar93,0x55);
  auVar22 = vshufps_avx(auVar93,auVar93,0xaa);
  fVar199 = auVar22._0_4_;
  fVar200 = auVar22._4_4_;
  fVar201 = auVar22._8_4_;
  fVar202 = auVar22._12_4_;
  fVar156 = auVar240._0_4_;
  fVar157 = auVar240._4_4_;
  fVar158 = auVar240._8_4_;
  fVar159 = auVar240._12_4_;
  fVar203 = auVar101._0_4_;
  fVar204 = auVar101._4_4_;
  fVar131 = auVar101._8_4_;
  fVar155 = auVar101._12_4_;
  fVar182 = auVar84._28_4_;
  auVar216._0_4_ = fVar203 * auVar84._0_4_ + fVar156 * auVar14._0_4_ + fVar199 * auVar15._0_4_;
  auVar216._4_4_ = fVar204 * auVar84._4_4_ + fVar157 * auVar14._4_4_ + fVar200 * auVar15._4_4_;
  auVar216._8_4_ = fVar131 * auVar84._8_4_ + fVar158 * auVar14._8_4_ + fVar201 * auVar15._8_4_;
  auVar216._12_4_ = fVar155 * auVar84._12_4_ + fVar159 * auVar14._12_4_ + fVar202 * auVar15._12_4_;
  auVar216._16_4_ = fVar203 * auVar84._16_4_ + fVar156 * auVar14._16_4_ + fVar199 * auVar15._16_4_;
  auVar216._20_4_ = fVar204 * auVar84._20_4_ + fVar157 * auVar14._20_4_ + fVar200 * auVar15._20_4_;
  auVar216._24_4_ = fVar131 * auVar84._24_4_ + fVar158 * auVar14._24_4_ + fVar201 * auVar15._24_4_;
  auVar216._28_4_ = fVar182 + auVar14._28_4_ + auVar15._28_4_;
  auVar126._0_4_ = fVar203 * auVar16._0_4_ + fVar156 * auVar17._0_4_ + fVar199 * auVar18._0_4_;
  auVar126._4_4_ = fVar204 * auVar16._4_4_ + fVar157 * auVar17._4_4_ + fVar200 * auVar18._4_4_;
  auVar126._8_4_ = fVar131 * auVar16._8_4_ + fVar158 * auVar17._8_4_ + fVar201 * auVar18._8_4_;
  auVar126._12_4_ = fVar155 * auVar16._12_4_ + fVar159 * auVar17._12_4_ + fVar202 * auVar18._12_4_;
  auVar126._16_4_ = fVar203 * auVar16._16_4_ + fVar156 * auVar17._16_4_ + fVar199 * auVar18._16_4_;
  auVar126._20_4_ = fVar204 * auVar16._20_4_ + fVar157 * auVar17._20_4_ + fVar200 * auVar18._20_4_;
  auVar126._24_4_ = fVar131 * auVar16._24_4_ + fVar158 * auVar17._24_4_ + fVar201 * auVar18._24_4_;
  auVar126._28_4_ = fVar182 + auVar15._28_4_ + auVar18._28_4_;
  auVar110._0_4_ = fVar203 * auVar19._0_4_ + fVar156 * auVar20._0_4_ + auVar21._0_4_ * fVar199;
  auVar110._4_4_ = fVar204 * auVar19._4_4_ + fVar157 * auVar20._4_4_ + auVar21._4_4_ * fVar200;
  auVar110._8_4_ = fVar131 * auVar19._8_4_ + fVar158 * auVar20._8_4_ + auVar21._8_4_ * fVar201;
  auVar110._12_4_ = fVar155 * auVar19._12_4_ + fVar159 * auVar20._12_4_ + auVar21._12_4_ * fVar202;
  auVar110._16_4_ = fVar203 * auVar19._16_4_ + fVar156 * auVar20._16_4_ + auVar21._16_4_ * fVar199;
  auVar110._20_4_ = fVar204 * auVar19._20_4_ + fVar157 * auVar20._20_4_ + auVar21._20_4_ * fVar200;
  auVar110._24_4_ = fVar131 * auVar19._24_4_ + fVar158 * auVar20._24_4_ + auVar21._24_4_ * fVar201;
  auVar110._28_4_ = fVar182 + auVar17._28_4_ + fVar202;
  auVar85._8_4_ = 0x7fffffff;
  auVar85._0_8_ = 0x7fffffff7fffffff;
  auVar85._12_4_ = 0x7fffffff;
  auVar85._16_4_ = 0x7fffffff;
  auVar85._20_4_ = 0x7fffffff;
  auVar85._24_4_ = 0x7fffffff;
  auVar85._28_4_ = 0x7fffffff;
  auVar148._8_4_ = 0x219392ef;
  auVar148._0_8_ = 0x219392ef219392ef;
  auVar148._12_4_ = 0x219392ef;
  auVar148._16_4_ = 0x219392ef;
  auVar148._20_4_ = 0x219392ef;
  auVar148._24_4_ = 0x219392ef;
  auVar148._28_4_ = 0x219392ef;
  auVar84 = vandps_avx(auVar292,auVar85);
  auVar84 = vcmpps_avx(auVar84,auVar148,1);
  auVar14 = vblendvps_avx(auVar292,auVar148,auVar84);
  auVar84 = vandps_avx(auVar282,auVar85);
  auVar84 = vcmpps_avx(auVar84,auVar148,1);
  auVar15 = vblendvps_avx(auVar282,auVar148,auVar84);
  auVar84 = vandps_avx(auVar198,auVar85);
  auVar84 = vcmpps_avx(auVar84,auVar148,1);
  auVar84 = vblendvps_avx(auVar198,auVar148,auVar84);
  auVar16 = vrcpps_avx(auVar14);
  fVar182 = auVar16._0_4_;
  fVar199 = auVar16._4_4_;
  auVar17._4_4_ = auVar14._4_4_ * fVar199;
  auVar17._0_4_ = auVar14._0_4_ * fVar182;
  fVar200 = auVar16._8_4_;
  auVar17._8_4_ = auVar14._8_4_ * fVar200;
  fVar201 = auVar16._12_4_;
  auVar17._12_4_ = auVar14._12_4_ * fVar201;
  fVar202 = auVar16._16_4_;
  auVar17._16_4_ = auVar14._16_4_ * fVar202;
  fVar203 = auVar16._20_4_;
  auVar17._20_4_ = auVar14._20_4_ * fVar203;
  fVar204 = auVar16._24_4_;
  auVar17._24_4_ = auVar14._24_4_ * fVar204;
  auVar17._28_4_ = auVar14._28_4_;
  auVar251._8_4_ = 0x3f800000;
  auVar251._0_8_ = &DAT_3f8000003f800000;
  auVar251._12_4_ = 0x3f800000;
  auVar251._16_4_ = 0x3f800000;
  auVar251._20_4_ = 0x3f800000;
  auVar251._24_4_ = 0x3f800000;
  auVar251._28_4_ = 0x3f800000;
  auVar17 = vsubps_avx(auVar251,auVar17);
  fVar182 = fVar182 + fVar182 * auVar17._0_4_;
  fVar199 = fVar199 + fVar199 * auVar17._4_4_;
  fVar200 = fVar200 + fVar200 * auVar17._8_4_;
  fVar201 = fVar201 + fVar201 * auVar17._12_4_;
  fVar202 = fVar202 + fVar202 * auVar17._16_4_;
  fVar203 = fVar203 + fVar203 * auVar17._20_4_;
  fVar204 = fVar204 + fVar204 * auVar17._24_4_;
  auVar14 = vrcpps_avx(auVar15);
  fVar131 = auVar14._0_4_;
  fVar155 = auVar14._4_4_;
  auVar18._4_4_ = fVar155 * auVar15._4_4_;
  auVar18._0_4_ = fVar131 * auVar15._0_4_;
  fVar156 = auVar14._8_4_;
  auVar18._8_4_ = fVar156 * auVar15._8_4_;
  fVar157 = auVar14._12_4_;
  auVar18._12_4_ = fVar157 * auVar15._12_4_;
  fVar158 = auVar14._16_4_;
  auVar18._16_4_ = fVar158 * auVar15._16_4_;
  fVar159 = auVar14._20_4_;
  auVar18._20_4_ = fVar159 * auVar15._20_4_;
  fVar160 = auVar14._24_4_;
  auVar18._24_4_ = fVar160 * auVar15._24_4_;
  auVar18._28_4_ = auVar17._28_4_;
  auVar14 = vsubps_avx(auVar251,auVar18);
  fVar131 = fVar131 + fVar131 * auVar14._0_4_;
  fVar155 = fVar155 + fVar155 * auVar14._4_4_;
  fVar156 = fVar156 + fVar156 * auVar14._8_4_;
  fVar157 = fVar157 + fVar157 * auVar14._12_4_;
  fVar158 = fVar158 + fVar158 * auVar14._16_4_;
  fVar159 = fVar159 + fVar159 * auVar14._20_4_;
  fVar160 = fVar160 + fVar160 * auVar14._24_4_;
  auVar14 = vrcpps_avx(auVar84);
  fVar161 = auVar14._0_4_;
  fVar174 = auVar14._4_4_;
  auVar15._4_4_ = fVar174 * auVar84._4_4_;
  auVar15._0_4_ = fVar161 * auVar84._0_4_;
  fVar176 = auVar14._8_4_;
  auVar15._8_4_ = fVar176 * auVar84._8_4_;
  fVar177 = auVar14._12_4_;
  auVar15._12_4_ = fVar177 * auVar84._12_4_;
  fVar179 = auVar14._16_4_;
  auVar15._16_4_ = fVar179 * auVar84._16_4_;
  fVar180 = auVar14._20_4_;
  auVar15._20_4_ = fVar180 * auVar84._20_4_;
  fVar181 = auVar14._24_4_;
  auVar15._24_4_ = fVar181 * auVar84._24_4_;
  auVar15._28_4_ = auVar84._28_4_;
  auVar84 = vsubps_avx(auVar251,auVar15);
  auVar101._8_8_ = 0;
  auVar101._0_8_ = *(ulong *)(prim + uVar75 * 7 + 6);
  auVar101 = vpmovsxwd_avx(auVar101);
  auVar240._8_8_ = 0;
  auVar240._0_8_ = *(ulong *)(prim + uVar75 * 7 + 0xe);
  auVar240 = vpmovsxwd_avx(auVar240);
  fVar161 = fVar161 + fVar161 * auVar84._0_4_;
  fVar174 = fVar174 + fVar174 * auVar84._4_4_;
  fVar176 = fVar176 + fVar176 * auVar84._8_4_;
  fVar177 = fVar177 + fVar177 * auVar84._12_4_;
  fVar179 = fVar179 + fVar179 * auVar84._16_4_;
  fVar180 = fVar180 + fVar180 * auVar84._20_4_;
  fVar181 = fVar181 + fVar181 * auVar84._24_4_;
  auVar86._16_16_ = auVar240;
  auVar86._0_16_ = auVar101;
  auVar84 = vcvtdq2ps_avx(auVar86);
  auVar84 = vsubps_avx(auVar84,auVar216);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + lVar13 + 6);
  auVar101 = vpmovsxwd_avx(auVar22);
  auVar196._8_8_ = 0;
  auVar196._0_8_ = *(ulong *)(prim + lVar13 + 0xe);
  auVar240 = vpmovsxwd_avx(auVar196);
  auVar76._0_4_ = fVar182 * auVar84._0_4_;
  auVar76._4_4_ = fVar199 * auVar84._4_4_;
  auVar76._8_4_ = fVar200 * auVar84._8_4_;
  auVar76._12_4_ = fVar201 * auVar84._12_4_;
  auVar19._16_4_ = fVar202 * auVar84._16_4_;
  auVar19._0_16_ = auVar76;
  auVar19._20_4_ = fVar203 * auVar84._20_4_;
  auVar19._24_4_ = fVar204 * auVar84._24_4_;
  auVar19._28_4_ = auVar84._28_4_;
  auVar232._16_16_ = auVar240;
  auVar232._0_16_ = auVar101;
  auVar84 = vcvtdq2ps_avx(auVar232);
  auVar84 = vsubps_avx(auVar84,auVar216);
  lVar72 = (ulong)(byte)PVar8 * 0x10;
  auVar143._8_8_ = 0;
  auVar143._0_8_ = *(ulong *)(prim + lVar72 + 6);
  auVar101 = vpmovsxwd_avx(auVar143);
  auVar100._8_8_ = 0;
  auVar100._0_8_ = *(ulong *)(prim + lVar72 + 0xe);
  auVar240 = vpmovsxwd_avx(auVar100);
  lVar72 = lVar72 + uVar75 * -2;
  auVar142._8_8_ = 0;
  auVar142._0_8_ = *(ulong *)(prim + lVar72 + 6);
  auVar22 = vpmovsxwd_avx(auVar142);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + lVar72 + 0xe);
  auVar196 = vpmovsxwd_avx(auVar82);
  auVar184._0_4_ = fVar182 * auVar84._0_4_;
  auVar184._4_4_ = fVar199 * auVar84._4_4_;
  auVar184._8_4_ = fVar200 * auVar84._8_4_;
  auVar184._12_4_ = fVar201 * auVar84._12_4_;
  auVar20._16_4_ = fVar202 * auVar84._16_4_;
  auVar20._0_16_ = auVar184;
  auVar20._20_4_ = fVar203 * auVar84._20_4_;
  auVar20._24_4_ = fVar204 * auVar84._24_4_;
  auVar20._28_4_ = auVar16._28_4_ + auVar17._28_4_;
  auVar217._16_16_ = auVar196;
  auVar217._0_16_ = auVar22;
  auVar84 = vcvtdq2ps_avx(auVar217);
  auVar84 = vsubps_avx(auVar84,auVar126);
  auVar205._0_4_ = fVar131 * auVar84._0_4_;
  auVar205._4_4_ = fVar155 * auVar84._4_4_;
  auVar205._8_4_ = fVar156 * auVar84._8_4_;
  auVar205._12_4_ = fVar157 * auVar84._12_4_;
  auVar16._16_4_ = fVar158 * auVar84._16_4_;
  auVar16._0_16_ = auVar205;
  auVar16._20_4_ = fVar159 * auVar84._20_4_;
  auVar16._24_4_ = fVar160 * auVar84._24_4_;
  auVar16._28_4_ = auVar84._28_4_;
  auVar233._16_16_ = auVar240;
  auVar233._0_16_ = auVar101;
  auVar84 = vcvtdq2ps_avx(auVar233);
  auVar84 = vsubps_avx(auVar84,auVar126);
  auVar118._8_8_ = 0;
  auVar118._0_8_ = *(ulong *)(prim + uVar73 + uVar75 + 6);
  auVar101 = vpmovsxwd_avx(auVar118);
  auVar241._8_8_ = 0;
  auVar241._0_8_ = *(ulong *)(prim + uVar73 + uVar75 + 0xe);
  auVar240 = vpmovsxwd_avx(auVar241);
  auVar115._0_4_ = fVar131 * auVar84._0_4_;
  auVar115._4_4_ = fVar155 * auVar84._4_4_;
  auVar115._8_4_ = fVar156 * auVar84._8_4_;
  auVar115._12_4_ = fVar157 * auVar84._12_4_;
  auVar21._16_4_ = fVar158 * auVar84._16_4_;
  auVar21._0_16_ = auVar115;
  auVar21._20_4_ = fVar159 * auVar84._20_4_;
  auVar21._24_4_ = fVar160 * auVar84._24_4_;
  auVar21._28_4_ = auVar84._28_4_;
  auVar149._16_16_ = auVar240;
  auVar149._0_16_ = auVar101;
  auVar84 = vcvtdq2ps_avx(auVar149);
  auVar84 = vsubps_avx(auVar84,auVar110);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar75 * 0x17 + 6);
  auVar101 = vpmovsxwd_avx(auVar7);
  auVar227._8_8_ = 0;
  auVar227._0_8_ = *(ulong *)(prim + uVar75 * 0x17 + 0xe);
  auVar240 = vpmovsxwd_avx(auVar227);
  auVar132._0_4_ = fVar161 * auVar84._0_4_;
  auVar132._4_4_ = fVar174 * auVar84._4_4_;
  auVar132._8_4_ = fVar176 * auVar84._8_4_;
  auVar132._12_4_ = fVar177 * auVar84._12_4_;
  auVar23._16_4_ = fVar179 * auVar84._16_4_;
  auVar23._0_16_ = auVar132;
  auVar23._20_4_ = fVar180 * auVar84._20_4_;
  auVar23._24_4_ = fVar181 * auVar84._24_4_;
  auVar23._28_4_ = auVar84._28_4_;
  auVar234._16_16_ = auVar240;
  auVar234._0_16_ = auVar101;
  auVar84 = vcvtdq2ps_avx(auVar234);
  auVar84 = vsubps_avx(auVar84,auVar110);
  auVar94._0_4_ = fVar161 * auVar84._0_4_;
  auVar94._4_4_ = fVar174 * auVar84._4_4_;
  auVar94._8_4_ = fVar176 * auVar84._8_4_;
  auVar94._12_4_ = fVar177 * auVar84._12_4_;
  auVar24._16_4_ = fVar179 * auVar84._16_4_;
  auVar24._0_16_ = auVar94;
  auVar24._20_4_ = fVar180 * auVar84._20_4_;
  auVar24._24_4_ = fVar181 * auVar84._24_4_;
  auVar24._28_4_ = auVar84._28_4_;
  auVar101 = vpminsd_avx(auVar19._16_16_,auVar20._16_16_);
  auVar240 = vpminsd_avx(auVar76,auVar184);
  auVar273._16_16_ = auVar101;
  auVar273._0_16_ = auVar240;
  auVar101 = vpminsd_avx(auVar16._16_16_,auVar21._16_16_);
  auVar240 = vpminsd_avx(auVar205,auVar115);
  auVar283._16_16_ = auVar101;
  auVar283._0_16_ = auVar240;
  auVar84 = vmaxps_avx(auVar273,auVar283);
  auVar101 = vpminsd_avx(auVar23._16_16_,auVar24._16_16_);
  auVar240 = vpminsd_avx(auVar132,auVar94);
  auVar306._16_16_ = auVar101;
  auVar306._0_16_ = auVar240;
  uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar313._4_4_ = uVar3;
  auVar313._0_4_ = uVar3;
  auVar313._8_4_ = uVar3;
  auVar313._12_4_ = uVar3;
  auVar313._16_4_ = uVar3;
  auVar313._20_4_ = uVar3;
  auVar313._24_4_ = uVar3;
  auVar313._28_4_ = uVar3;
  auVar14 = vmaxps_avx(auVar306,auVar313);
  auVar84 = vmaxps_avx(auVar84,auVar14);
  local_178._4_4_ = auVar84._4_4_ * 0.99999964;
  local_178._0_4_ = auVar84._0_4_ * 0.99999964;
  local_178._8_4_ = auVar84._8_4_ * 0.99999964;
  local_178._12_4_ = auVar84._12_4_ * 0.99999964;
  local_178._16_4_ = auVar84._16_4_ * 0.99999964;
  local_178._20_4_ = auVar84._20_4_ * 0.99999964;
  local_178._24_4_ = auVar84._24_4_ * 0.99999964;
  local_178._28_4_ = auVar84._28_4_;
  auVar101 = vpmaxsd_avx(auVar19._16_16_,auVar20._16_16_);
  auVar240 = vpmaxsd_avx(auVar76,auVar184);
  auVar87._16_16_ = auVar101;
  auVar87._0_16_ = auVar240;
  auVar101 = vpmaxsd_avx(auVar16._16_16_,auVar21._16_16_);
  auVar240 = vpmaxsd_avx(auVar205,auVar115);
  auVar127._16_16_ = auVar101;
  auVar127._0_16_ = auVar240;
  auVar84 = vminps_avx(auVar87,auVar127);
  auVar101 = vpmaxsd_avx(auVar23._16_16_,auVar24._16_16_);
  auVar240 = vpmaxsd_avx(auVar132,auVar94);
  fVar182 = ray->tfar;
  auVar150._4_4_ = fVar182;
  auVar150._0_4_ = fVar182;
  auVar150._8_4_ = fVar182;
  auVar150._12_4_ = fVar182;
  auVar150._16_4_ = fVar182;
  auVar150._20_4_ = fVar182;
  auVar150._24_4_ = fVar182;
  auVar150._28_4_ = fVar182;
  auVar111._16_16_ = auVar101;
  auVar111._0_16_ = auVar240;
  auVar14 = vminps_avx(auVar111,auVar150);
  auVar84 = vminps_avx(auVar84,auVar14);
  auVar14._4_4_ = auVar84._4_4_ * 1.0000004;
  auVar14._0_4_ = auVar84._0_4_ * 1.0000004;
  auVar14._8_4_ = auVar84._8_4_ * 1.0000004;
  auVar14._12_4_ = auVar84._12_4_ * 1.0000004;
  auVar14._16_4_ = auVar84._16_4_ * 1.0000004;
  auVar14._20_4_ = auVar84._20_4_ * 1.0000004;
  auVar14._24_4_ = auVar84._24_4_ * 1.0000004;
  auVar14._28_4_ = auVar84._28_4_;
  auVar84 = vcmpps_avx(local_178,auVar14,2);
  auVar101 = vpshufd_avx(ZEXT116((byte)PVar8),0);
  auVar112._16_16_ = auVar101;
  auVar112._0_16_ = auVar101;
  auVar14 = vcvtdq2ps_avx(auVar112);
  auVar14 = vcmpps_avx(_DAT_02020f40,auVar14,1);
  auVar84 = vandps_avx(auVar84,auVar14);
  uVar69 = vmovmskps_avx(auVar84);
  local_4d9 = uVar69 != 0;
  if (uVar69 == 0) {
    return local_4d9;
  }
  uVar69 = uVar69 & 0xff;
  auVar88._16_16_ = mm_lookupmask_ps._240_16_;
  auVar88._0_16_ = mm_lookupmask_ps._240_16_;
  local_1b8 = vblendps_avx(auVar88,ZEXT832(0) << 0x20,0x80);
  local_2c0 = prim;
LAB_01169ba8:
  uVar75 = (ulong)uVar69;
  lVar72 = 0;
  if (uVar75 != 0) {
    for (; (uVar69 >> lVar72 & 1) == 0; lVar72 = lVar72 + 1) {
    }
  }
  local_3f0 = (ulong)*(uint *)(local_2c0 + 2);
  local_2c8 = (ulong)*(uint *)(local_2c0 + lVar72 * 4 + 6);
  pGVar9 = (context->scene->geometries).items[local_3f0].ptr;
  uVar73 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                           pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * local_2c8);
  p_Var10 = pGVar9[1].intersectionFilterN;
  pvVar11 = pGVar9[2].userPtr;
  _Var12 = pGVar9[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  pfVar1 = (float *)(_Var12 + uVar73 * (long)pvVar11);
  fVar182 = *pfVar1;
  fVar199 = pfVar1[1];
  fVar200 = pfVar1[2];
  fVar201 = pfVar1[3];
  pfVar1 = (float *)(_Var12 + (uVar73 + 1) * (long)pvVar11);
  fVar202 = *pfVar1;
  fVar203 = pfVar1[1];
  fVar204 = pfVar1[2];
  fVar131 = pfVar1[3];
  puVar2 = (undefined8 *)(_Var12 + (uVar73 + 2) * (long)pvVar11);
  uVar4 = *puVar2;
  uVar64 = puVar2[1];
  pfVar1 = (float *)(_Var12 + (long)pvVar11 * (uVar73 + 3));
  fVar155 = *pfVar1;
  fVar156 = pfVar1[1];
  fVar157 = pfVar1[2];
  fVar158 = pfVar1[3];
  uVar75 = uVar75 - 1 & uVar75;
  lVar72 = *(long *)&pGVar9[1].time_range.upper;
  pfVar1 = (float *)(lVar72 + (long)p_Var10 * uVar73);
  fVar159 = *pfVar1;
  fVar160 = pfVar1[1];
  fVar161 = pfVar1[2];
  fVar174 = pfVar1[3];
  pfVar1 = (float *)(lVar72 + (long)p_Var10 * (uVar73 + 1));
  fVar176 = *pfVar1;
  fVar177 = pfVar1[1];
  fVar179 = pfVar1[2];
  fVar180 = pfVar1[3];
  pfVar1 = (float *)(lVar72 + (long)p_Var10 * (uVar73 + 2));
  fVar181 = *pfVar1;
  fVar284 = pfVar1[1];
  fVar175 = pfVar1[2];
  fVar285 = pfVar1[3];
  lVar13 = 0;
  if (uVar75 != 0) {
    for (; (uVar75 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
    }
  }
  pfVar1 = (float *)(lVar72 + (long)p_Var10 * (uVar73 + 3));
  fVar178 = *pfVar1;
  fVar286 = pfVar1[1];
  fVar287 = pfVar1[2];
  fVar288 = pfVar1[3];
  if (((uVar75 != 0) && (uVar73 = uVar75 - 1 & uVar75, uVar73 != 0)) && (lVar72 = 0, uVar73 != 0)) {
    for (; (uVar73 >> lVar72 & 1) == 0; lVar72 = lVar72 + 1) {
    }
  }
  auVar77._0_4_ = fVar176 * 0.0 + fVar181 * 0.5 + fVar178 * 0.0;
  auVar77._4_4_ = fVar177 * 0.0 + fVar284 * 0.5 + fVar286 * 0.0;
  auVar77._8_4_ = fVar179 * 0.0 + fVar175 * 0.5 + fVar287 * 0.0;
  auVar77._12_4_ = fVar180 * 0.0 + fVar285 * 0.5 + fVar288 * 0.0;
  auVar275._0_4_ = fVar159 * 0.5;
  auVar275._4_4_ = fVar160 * 0.5;
  auVar275._8_4_ = fVar161 * 0.5;
  auVar275._12_4_ = fVar174 * 0.5;
  auVar82 = vsubps_avx(auVar77,auVar275);
  fVar289 = (float)uVar4;
  fVar219 = (float)((ulong)uVar4 >> 0x20);
  fVar290 = (float)uVar64;
  fVar220 = (float)((ulong)uVar64 >> 0x20);
  auVar276._0_4_ = fVar202 * 0.0 + fVar289 * 0.5 + fVar155 * 0.0;
  auVar276._4_4_ = fVar203 * 0.0 + fVar219 * 0.5 + fVar156 * 0.0;
  auVar276._8_4_ = fVar204 * 0.0 + fVar290 * 0.5 + fVar157 * 0.0;
  auVar276._12_4_ = fVar131 * 0.0 + fVar220 * 0.5 + fVar158 * 0.0;
  auVar316._0_4_ = fVar182 * 0.5;
  auVar316._4_4_ = fVar199 * 0.5;
  auVar316._8_4_ = fVar200 * 0.5;
  auVar316._12_4_ = fVar201 * 0.5;
  auVar196 = vsubps_avx(auVar276,auVar316);
  local_408._0_4_ = fVar159 * -0.0 + fVar176 + fVar181 * 0.0 + fVar178 * -0.0;
  local_408._4_4_ = fVar160 * -0.0 + fVar177 + fVar284 * 0.0 + fVar286 * -0.0;
  fStack_400 = fVar161 * -0.0 + fVar179 + fVar175 * 0.0 + fVar287 * -0.0;
  fStack_3fc = fVar174 * -0.0 + fVar180 + fVar285 * 0.0 + fVar288 * -0.0;
  local_448._0_4_ = fVar159 * -0.0 + fVar176 * 0.0 + fVar178 * -0.0 + fVar181;
  local_448._4_4_ = fVar160 * -0.0 + fVar177 * 0.0 + fVar286 * -0.0 + fVar284;
  fStack_440 = fVar161 * -0.0 + fVar179 * 0.0 + fVar287 * -0.0 + fVar175;
  fStack_43c = fVar174 * -0.0 + fVar180 * 0.0 + fVar288 * -0.0 + fVar285;
  auVar254._0_4_ = fVar181 * 0.0 + fVar178 * 0.5;
  auVar254._4_4_ = fVar284 * 0.0 + fVar286 * 0.5;
  auVar254._8_4_ = fVar175 * 0.0 + fVar287 * 0.5;
  auVar254._12_4_ = fVar285 * 0.0 + fVar288 * 0.5;
  auVar317._0_4_ = fVar182 * -0.0 + fVar289 * 0.0 + fVar155 * -0.0 + fVar202;
  auVar317._4_4_ = fVar199 * -0.0 + fVar219 * 0.0 + fVar156 * -0.0 + fVar203;
  auVar317._8_4_ = fVar200 * -0.0 + fVar290 * 0.0 + fVar157 * -0.0 + fVar204;
  auVar317._12_4_ = fVar201 * -0.0 + fVar220 * 0.0 + fVar158 * -0.0 + fVar131;
  auVar236._0_4_ = fVar176 * 0.5;
  auVar236._4_4_ = fVar177 * 0.5;
  auVar236._8_4_ = fVar179 * 0.5;
  auVar236._12_4_ = fVar180 * 0.5;
  auVar101 = vsubps_avx(auVar254,auVar236);
  auVar162._0_4_ = auVar101._0_4_ + fVar159 * 0.0;
  auVar162._4_4_ = auVar101._4_4_ + fVar160 * 0.0;
  auVar162._8_4_ = auVar101._8_4_ + fVar161 * 0.0;
  auVar162._12_4_ = auVar101._12_4_ + fVar174 * 0.0;
  auVar237._0_4_ = fVar182 * -0.0 + fVar202 * 0.0 + fVar155 * -0.0 + fVar289;
  auVar237._4_4_ = fVar199 * -0.0 + fVar203 * 0.0 + fVar156 * -0.0 + fVar219;
  auVar237._8_4_ = fVar200 * -0.0 + fVar204 * 0.0 + fVar157 * -0.0 + fVar290;
  auVar237._12_4_ = fVar201 * -0.0 + fVar131 * 0.0 + fVar158 * -0.0 + fVar220;
  auVar206._0_4_ = fVar289 * 0.0 + fVar155 * 0.5;
  auVar206._4_4_ = fVar219 * 0.0 + fVar156 * 0.5;
  auVar206._8_4_ = fVar290 * 0.0 + fVar157 * 0.5;
  auVar206._12_4_ = fVar220 * 0.0 + fVar158 * 0.5;
  auVar185._0_4_ = fVar202 * 0.5;
  auVar185._4_4_ = fVar203 * 0.5;
  auVar185._8_4_ = fVar204 * 0.5;
  auVar185._12_4_ = fVar131 * 0.5;
  auVar101 = vsubps_avx(auVar206,auVar185);
  auVar186._0_4_ = fVar182 * 0.0 + auVar101._0_4_;
  auVar186._4_4_ = fVar199 * 0.0 + auVar101._4_4_;
  auVar186._8_4_ = fVar200 * 0.0 + auVar101._8_4_;
  auVar186._12_4_ = fVar201 * 0.0 + auVar101._12_4_;
  auVar101 = vshufps_avx(auVar82,auVar82,0xc9);
  auVar240 = vshufps_avx(auVar317,auVar317,0xc9);
  fVar161 = auVar82._0_4_;
  auVar207._0_4_ = fVar161 * auVar240._0_4_;
  fVar174 = auVar82._4_4_;
  auVar207._4_4_ = fVar174 * auVar240._4_4_;
  fVar176 = auVar82._8_4_;
  auVar207._8_4_ = fVar176 * auVar240._8_4_;
  fVar177 = auVar82._12_4_;
  auVar207._12_4_ = fVar177 * auVar240._12_4_;
  auVar222._0_4_ = auVar317._0_4_ * auVar101._0_4_;
  auVar222._4_4_ = auVar317._4_4_ * auVar101._4_4_;
  auVar222._8_4_ = auVar317._8_4_ * auVar101._8_4_;
  auVar222._12_4_ = auVar317._12_4_ * auVar101._12_4_;
  auVar240 = vsubps_avx(auVar222,auVar207);
  auVar22 = vshufps_avx(auVar240,auVar240,0xc9);
  auVar240 = vshufps_avx(auVar196,auVar196,0xc9);
  auVar208._0_4_ = fVar161 * auVar240._0_4_;
  auVar208._4_4_ = fVar174 * auVar240._4_4_;
  auVar208._8_4_ = fVar176 * auVar240._8_4_;
  auVar208._12_4_ = fVar177 * auVar240._12_4_;
  auVar133._0_4_ = auVar196._0_4_ * auVar101._0_4_;
  auVar133._4_4_ = auVar196._4_4_ * auVar101._4_4_;
  auVar133._8_4_ = auVar196._8_4_ * auVar101._8_4_;
  auVar133._12_4_ = auVar196._12_4_ * auVar101._12_4_;
  auVar101 = vsubps_avx(auVar133,auVar208);
  auVar196 = vshufps_avx(auVar101,auVar101,0xc9);
  auVar101 = vshufps_avx(auVar162,auVar162,0xc9);
  auVar240 = vshufps_avx(auVar237,auVar237,0xc9);
  auVar134._0_4_ = auVar162._0_4_ * auVar240._0_4_;
  auVar134._4_4_ = auVar162._4_4_ * auVar240._4_4_;
  auVar134._8_4_ = auVar162._8_4_ * auVar240._8_4_;
  auVar134._12_4_ = auVar162._12_4_ * auVar240._12_4_;
  auVar238._0_4_ = auVar237._0_4_ * auVar101._0_4_;
  auVar238._4_4_ = auVar237._4_4_ * auVar101._4_4_;
  auVar238._8_4_ = auVar237._8_4_ * auVar101._8_4_;
  auVar238._12_4_ = auVar237._12_4_ * auVar101._12_4_;
  auVar240 = vsubps_avx(auVar238,auVar134);
  auVar143 = vshufps_avx(auVar240,auVar240,0xc9);
  auVar240 = vshufps_avx(auVar186,auVar186,0xc9);
  auVar239._0_4_ = auVar240._0_4_ * auVar162._0_4_;
  auVar239._4_4_ = auVar240._4_4_ * auVar162._4_4_;
  auVar239._8_4_ = auVar240._8_4_ * auVar162._8_4_;
  auVar239._12_4_ = auVar240._12_4_ * auVar162._12_4_;
  auVar187._0_4_ = auVar101._0_4_ * auVar186._0_4_;
  auVar187._4_4_ = auVar101._4_4_ * auVar186._4_4_;
  auVar187._8_4_ = auVar101._8_4_ * auVar186._8_4_;
  auVar187._12_4_ = auVar101._12_4_ * auVar186._12_4_;
  auVar240 = vsubps_avx(auVar187,auVar239);
  auVar101 = vdpps_avx(auVar22,auVar22,0x7f);
  auVar100 = vshufps_avx(auVar240,auVar240,0xc9);
  fVar202 = auVar101._0_4_;
  auVar241 = ZEXT416((uint)fVar202);
  auVar240 = vrsqrtss_avx(auVar241,auVar241);
  fVar182 = auVar240._0_4_;
  auVar240 = vdpps_avx(auVar22,auVar196,0x7f);
  auVar142 = ZEXT416((uint)(fVar182 * 1.5 - fVar202 * 0.5 * fVar182 * fVar182 * fVar182));
  auVar142 = vshufps_avx(auVar142,auVar142,0);
  fVar182 = auVar142._0_4_ * auVar22._0_4_;
  fVar199 = auVar142._4_4_ * auVar22._4_4_;
  fVar200 = auVar142._8_4_ * auVar22._8_4_;
  fVar201 = auVar142._12_4_ * auVar22._12_4_;
  auVar101 = vshufps_avx(auVar101,auVar101,0);
  auVar255._0_4_ = auVar196._0_4_ * auVar101._0_4_;
  auVar255._4_4_ = auVar196._4_4_ * auVar101._4_4_;
  auVar255._8_4_ = auVar196._8_4_ * auVar101._8_4_;
  auVar255._12_4_ = auVar196._12_4_ * auVar101._12_4_;
  auVar101 = vshufps_avx(auVar240,auVar240,0);
  auVar223._0_4_ = auVar101._0_4_ * auVar22._0_4_;
  auVar223._4_4_ = auVar101._4_4_ * auVar22._4_4_;
  auVar223._8_4_ = auVar101._8_4_ * auVar22._8_4_;
  auVar223._12_4_ = auVar101._12_4_ * auVar22._12_4_;
  auVar118 = vsubps_avx(auVar255,auVar223);
  auVar240 = vrcpss_avx(auVar241,auVar241);
  auVar101 = vdpps_avx(auVar143,auVar143,0x7f);
  auVar240 = ZEXT416((uint)(auVar240._0_4_ * (2.0 - fVar202 * auVar240._0_4_)));
  auVar22 = vshufps_avx(auVar240,auVar240,0);
  fVar202 = auVar101._0_4_;
  auVar241 = ZEXT416((uint)fVar202);
  auVar240 = vrsqrtss_avx(auVar241,auVar241);
  fVar203 = auVar240._0_4_;
  auVar240 = ZEXT416((uint)(fVar203 * 1.5 - fVar202 * 0.5 * fVar203 * fVar203 * fVar203));
  auVar196 = vshufps_avx(auVar240,auVar240,0);
  auVar240 = vdpps_avx(auVar143,auVar100,0x7f);
  fVar203 = auVar196._0_4_ * auVar143._0_4_;
  fVar204 = auVar196._4_4_ * auVar143._4_4_;
  fVar131 = auVar196._8_4_ * auVar143._8_4_;
  fVar155 = auVar196._12_4_ * auVar143._12_4_;
  auVar101 = vshufps_avx(auVar101,auVar101,0);
  auVar209._0_4_ = auVar101._0_4_ * auVar100._0_4_;
  auVar209._4_4_ = auVar101._4_4_ * auVar100._4_4_;
  auVar209._8_4_ = auVar101._8_4_ * auVar100._8_4_;
  auVar209._12_4_ = auVar101._12_4_ * auVar100._12_4_;
  auVar101 = vshufps_avx(auVar240,auVar240,0);
  auVar135._0_4_ = auVar101._0_4_ * auVar143._0_4_;
  auVar135._4_4_ = auVar101._4_4_ * auVar143._4_4_;
  auVar135._8_4_ = auVar101._8_4_ * auVar143._8_4_;
  auVar135._12_4_ = auVar101._12_4_ * auVar143._12_4_;
  auVar100 = vsubps_avx(auVar209,auVar135);
  auVar101 = vrcpss_avx(auVar241,auVar241);
  auVar101 = ZEXT416((uint)((2.0 - fVar202 * auVar101._0_4_) * auVar101._0_4_));
  auVar101 = vshufps_avx(auVar101,auVar101,0);
  auVar240 = vshufps_avx(_local_408,_local_408,0xff);
  auVar242._0_4_ = auVar240._0_4_ * fVar182;
  auVar242._4_4_ = auVar240._4_4_ * fVar199;
  auVar242._8_4_ = auVar240._8_4_ * fVar200;
  auVar242._12_4_ = auVar240._12_4_ * fVar201;
  _local_368 = vsubps_avx(_local_408,auVar242);
  auVar143 = vshufps_avx(auVar82,auVar82,0xff);
  auVar188._0_4_ =
       auVar143._0_4_ * fVar182 + auVar240._0_4_ * auVar142._0_4_ * auVar22._0_4_ * auVar118._0_4_;
  auVar188._4_4_ =
       auVar143._4_4_ * fVar199 + auVar240._4_4_ * auVar142._4_4_ * auVar22._4_4_ * auVar118._4_4_;
  auVar188._8_4_ =
       auVar143._8_4_ * fVar200 + auVar240._8_4_ * auVar142._8_4_ * auVar22._8_4_ * auVar118._8_4_;
  auVar188._12_4_ =
       auVar143._12_4_ * fVar201 +
       auVar240._12_4_ * auVar142._12_4_ * auVar22._12_4_ * auVar118._12_4_;
  auVar143 = vsubps_avx(auVar82,auVar188);
  local_378._0_4_ = auVar242._0_4_ + (float)local_408._0_4_;
  local_378._4_4_ = auVar242._4_4_ + (float)local_408._4_4_;
  fStack_370 = auVar242._8_4_ + fStack_400;
  fStack_36c = auVar242._12_4_ + fStack_3fc;
  auVar240 = vshufps_avx(_local_448,_local_448,0xff);
  auVar116._0_4_ = fVar203 * auVar240._0_4_;
  auVar116._4_4_ = fVar204 * auVar240._4_4_;
  auVar116._8_4_ = fVar131 * auVar240._8_4_;
  auVar116._12_4_ = fVar155 * auVar240._12_4_;
  _local_388 = vsubps_avx(_local_448,auVar116);
  auVar22 = vshufps_avx(auVar162,auVar162,0xff);
  auVar78._0_4_ =
       fVar203 * auVar22._0_4_ + auVar240._0_4_ * auVar196._0_4_ * auVar100._0_4_ * auVar101._0_4_;
  auVar78._4_4_ =
       fVar204 * auVar22._4_4_ + auVar240._4_4_ * auVar196._4_4_ * auVar100._4_4_ * auVar101._4_4_;
  auVar78._8_4_ =
       fVar131 * auVar22._8_4_ + auVar240._8_4_ * auVar196._8_4_ * auVar100._8_4_ * auVar101._8_4_;
  auVar78._12_4_ =
       fVar155 * auVar22._12_4_ +
       auVar240._12_4_ * auVar196._12_4_ * auVar100._12_4_ * auVar101._12_4_;
  auVar101 = vsubps_avx(auVar162,auVar78);
  local_3e8 = (float)local_448._0_4_ + auVar116._0_4_;
  fStack_3e4 = (float)local_448._4_4_ + auVar116._4_4_;
  fStack_3e0 = fStack_440 + auVar116._8_4_;
  fStack_3dc = fStack_43c + auVar116._12_4_;
  local_398._0_4_ = local_368._0_4_ + auVar143._0_4_ * 0.33333334;
  local_398._4_4_ = local_368._4_4_ + auVar143._4_4_ * 0.33333334;
  fStack_390 = local_368._8_4_ + auVar143._8_4_ * 0.33333334;
  fStack_38c = local_368._12_4_ + auVar143._12_4_ * 0.33333334;
  auVar79._0_4_ = auVar101._0_4_ * 0.33333334;
  auVar79._4_4_ = auVar101._4_4_ * 0.33333334;
  auVar79._8_4_ = auVar101._8_4_ * 0.33333334;
  auVar79._12_4_ = auVar101._12_4_ * 0.33333334;
  _local_3a8 = vsubps_avx(_local_388,auVar79);
  aVar6 = (ray->org).field_0;
  auVar22 = vsubps_avx(_local_368,(undefined1  [16])aVar6);
  auVar240 = vmovsldup_avx(auVar22);
  auVar101 = vmovshdup_avx(auVar22);
  auVar22 = vshufps_avx(auVar22,auVar22,0xaa);
  fVar182 = (pre->ray_space).vx.field_0.m128[0];
  fVar199 = (pre->ray_space).vx.field_0.m128[1];
  fVar200 = (pre->ray_space).vx.field_0.m128[2];
  fVar201 = (pre->ray_space).vx.field_0.m128[3];
  fVar202 = (pre->ray_space).vy.field_0.m128[0];
  fVar203 = (pre->ray_space).vy.field_0.m128[1];
  fVar204 = (pre->ray_space).vy.field_0.m128[2];
  fVar131 = (pre->ray_space).vy.field_0.m128[3];
  fVar155 = (pre->ray_space).vz.field_0.m128[0];
  fVar156 = (pre->ray_space).vz.field_0.m128[1];
  fVar157 = (pre->ray_space).vz.field_0.m128[2];
  fVar158 = (pre->ray_space).vz.field_0.m128[3];
  fVar159 = fVar182 * auVar240._0_4_ + fVar202 * auVar101._0_4_ + fVar155 * auVar22._0_4_;
  fVar160 = fVar199 * auVar240._4_4_ + fVar203 * auVar101._4_4_ + fVar156 * auVar22._4_4_;
  local_408._4_4_ = fVar160;
  local_408._0_4_ = fVar159;
  fStack_400 = fVar200 * auVar240._8_4_ + fVar204 * auVar101._8_4_ + fVar157 * auVar22._8_4_;
  fStack_3fc = fVar201 * auVar240._12_4_ + fVar131 * auVar101._12_4_ + fVar158 * auVar22._12_4_;
  auVar22 = vsubps_avx(_local_398,(undefined1  [16])aVar6);
  auVar240 = vmovsldup_avx(auVar22);
  auVar101 = vmovshdup_avx(auVar22);
  auVar22 = vshufps_avx(auVar22,auVar22,0xaa);
  auVar95._0_4_ = fVar182 * auVar240._0_4_ + auVar101._0_4_ * fVar202 + fVar155 * auVar22._0_4_;
  auVar95._4_4_ = fVar199 * auVar240._4_4_ + auVar101._4_4_ * fVar203 + fVar156 * auVar22._4_4_;
  auVar95._8_4_ = fVar200 * auVar240._8_4_ + auVar101._8_4_ * fVar204 + fVar157 * auVar22._8_4_;
  auVar95._12_4_ = fVar201 * auVar240._12_4_ + auVar101._12_4_ * fVar131 + fVar158 * auVar22._12_4_;
  auVar240 = vsubps_avx(_local_3a8,(undefined1  [16])aVar6);
  auVar22 = vshufps_avx(auVar240,auVar240,0xaa);
  auVar101 = vmovshdup_avx(auVar240);
  auVar240 = vmovsldup_avx(auVar240);
  auVar318._0_4_ = auVar101._0_4_ * fVar202 + auVar22._0_4_ * fVar155 + fVar182 * auVar240._0_4_;
  auVar318._4_4_ = auVar101._4_4_ * fVar203 + auVar22._4_4_ * fVar156 + fVar199 * auVar240._4_4_;
  auVar318._8_4_ = auVar101._8_4_ * fVar204 + auVar22._8_4_ * fVar157 + fVar200 * auVar240._8_4_;
  auVar318._12_4_ = auVar101._12_4_ * fVar131 + auVar22._12_4_ * fVar158 + fVar201 * auVar240._12_4_
  ;
  auVar240 = vsubps_avx(_local_388,(undefined1  [16])aVar6);
  auVar22 = vshufps_avx(auVar240,auVar240,0xaa);
  auVar101 = vmovshdup_avx(auVar240);
  auVar240 = vmovsldup_avx(auVar240);
  auVar256._0_4_ = auVar240._0_4_ * fVar182 + auVar101._0_4_ * fVar202 + auVar22._0_4_ * fVar155;
  auVar256._4_4_ = auVar240._4_4_ * fVar199 + auVar101._4_4_ * fVar203 + auVar22._4_4_ * fVar156;
  auVar256._8_4_ = auVar240._8_4_ * fVar200 + auVar101._8_4_ * fVar204 + auVar22._8_4_ * fVar157;
  auVar256._12_4_ = auVar240._12_4_ * fVar201 + auVar101._12_4_ * fVar131 + auVar22._12_4_ * fVar158
  ;
  auVar240 = vsubps_avx(_local_378,(undefined1  [16])aVar6);
  auVar22 = vshufps_avx(auVar240,auVar240,0xaa);
  auVar101 = vmovshdup_avx(auVar240);
  auVar240 = vmovsldup_avx(auVar240);
  auVar267._0_4_ = auVar240._0_4_ * fVar182 + auVar101._0_4_ * fVar202 + auVar22._0_4_ * fVar155;
  auVar267._4_4_ = auVar240._4_4_ * fVar199 + auVar101._4_4_ * fVar203 + auVar22._4_4_ * fVar156;
  auVar267._8_4_ = auVar240._8_4_ * fVar200 + auVar101._8_4_ * fVar204 + auVar22._8_4_ * fVar157;
  auVar267._12_4_ = auVar240._12_4_ * fVar201 + auVar101._12_4_ * fVar131 + auVar22._12_4_ * fVar158
  ;
  local_3b8._0_4_ = (float)local_378._0_4_ + (fVar161 + auVar188._0_4_) * 0.33333334;
  local_3b8._4_4_ = (float)local_378._4_4_ + (fVar174 + auVar188._4_4_) * 0.33333334;
  fStack_3b0 = fStack_370 + (fVar176 + auVar188._8_4_) * 0.33333334;
  fStack_3ac = fStack_36c + (fVar177 + auVar188._12_4_) * 0.33333334;
  auVar240 = vsubps_avx(_local_3b8,(undefined1  [16])aVar6);
  auVar22 = vshufps_avx(auVar240,auVar240,0xaa);
  auVar101 = vmovshdup_avx(auVar240);
  auVar240 = vmovsldup_avx(auVar240);
  auVar311._0_8_ =
       CONCAT44(auVar240._4_4_ * fVar199 + auVar101._4_4_ * fVar203 + auVar22._4_4_ * fVar156,
                auVar240._0_4_ * fVar182 + auVar101._0_4_ * fVar202 + auVar22._0_4_ * fVar155);
  auVar311._8_4_ = auVar240._8_4_ * fVar200 + auVar101._8_4_ * fVar204 + auVar22._8_4_ * fVar157;
  auVar311._12_4_ = auVar240._12_4_ * fVar201 + auVar101._12_4_ * fVar131 + auVar22._12_4_ * fVar158
  ;
  auVar224._0_4_ = (auVar162._0_4_ + auVar78._0_4_) * 0.33333334;
  auVar224._4_4_ = (auVar162._4_4_ + auVar78._4_4_) * 0.33333334;
  auVar224._8_4_ = (auVar162._8_4_ + auVar78._8_4_) * 0.33333334;
  auVar224._12_4_ = (auVar162._12_4_ + auVar78._12_4_) * 0.33333334;
  auVar65._4_4_ = fStack_3e4;
  auVar65._0_4_ = local_3e8;
  auVar65._8_4_ = fStack_3e0;
  auVar65._12_4_ = fStack_3dc;
  _local_288 = vsubps_avx(auVar65,auVar224);
  auVar240 = vsubps_avx(_local_288,(undefined1  [16])aVar6);
  auVar22 = vshufps_avx(auVar240,auVar240,0xaa);
  auVar101 = vmovshdup_avx(auVar240);
  auVar240 = vmovsldup_avx(auVar240);
  auVar225._0_8_ =
       CONCAT44(auVar101._4_4_ * fVar203 + auVar22._4_4_ * fVar156 + fVar199 * auVar240._4_4_,
                auVar101._0_4_ * fVar202 + auVar22._0_4_ * fVar155 + fVar182 * auVar240._0_4_);
  auVar225._8_4_ = auVar101._8_4_ * fVar204 + auVar22._8_4_ * fVar157 + fVar200 * auVar240._8_4_;
  auVar225._12_4_ = auVar101._12_4_ * fVar131 + auVar22._12_4_ * fVar158 + fVar201 * auVar240._12_4_
  ;
  auVar240 = vsubps_avx(auVar65,(undefined1  [16])aVar6);
  auVar22 = vshufps_avx(auVar240,auVar240,0xaa);
  auVar101 = vmovshdup_avx(auVar240);
  auVar240 = vmovsldup_avx(auVar240);
  auVar80._0_8_ =
       CONCAT44(fVar199 * auVar240._4_4_ + auVar101._4_4_ * fVar203 + auVar22._4_4_ * fVar156,
                fVar182 * auVar240._0_4_ + auVar101._0_4_ * fVar202 + auVar22._0_4_ * fVar155);
  auVar80._8_4_ = fVar200 * auVar240._8_4_ + auVar101._8_4_ * fVar204 + auVar22._8_4_ * fVar157;
  auVar80._12_4_ = fVar201 * auVar240._12_4_ + auVar101._12_4_ * fVar131 + auVar22._12_4_ * fVar158;
  _local_2e8 = vmovlhps_avx(_local_408,auVar267);
  _local_2f8 = vmovlhps_avx(auVar95,auVar311);
  _local_308 = vmovlhps_avx(auVar318,auVar225);
  _local_408 = vmovlhps_avx(auVar256,auVar80);
  auVar101 = vminps_avx(_local_2e8,_local_2f8);
  auVar240 = vminps_avx(_local_308,_local_408);
  auVar22 = vminps_avx(auVar101,auVar240);
  auVar101 = vmaxps_avx(_local_2e8,_local_2f8);
  auVar240 = vmaxps_avx(_local_308,_local_408);
  auVar101 = vmaxps_avx(auVar101,auVar240);
  auVar240 = vshufpd_avx(auVar22,auVar22,3);
  auVar22 = vminps_avx(auVar22,auVar240);
  auVar240 = vshufpd_avx(auVar101,auVar101,3);
  auVar240 = vmaxps_avx(auVar101,auVar240);
  auVar210._8_4_ = 0x7fffffff;
  auVar210._0_8_ = 0x7fffffff7fffffff;
  auVar210._12_4_ = 0x7fffffff;
  auVar101 = vandps_avx(auVar22,auVar210);
  auVar240 = vandps_avx(auVar240,auVar210);
  auVar101 = vmaxps_avx(auVar101,auVar240);
  auVar240 = vmovshdup_avx(auVar101);
  auVar101 = vmaxss_avx(auVar240,auVar101);
  fVar182 = auVar101._0_4_ * 9.536743e-07;
  register0x00001588 = auVar311._0_8_;
  local_338 = auVar311._0_8_;
  register0x00001348 = auVar225._0_8_;
  local_348 = auVar225._0_8_;
  register0x00001388 = auVar80._0_8_;
  local_358 = auVar80._0_8_;
  local_2d8 = ZEXT416((uint)fVar182);
  auVar101 = vshufps_avx(local_2d8,ZEXT416((uint)fVar182),0);
  local_138._16_16_ = auVar101;
  local_138._0_16_ = auVar101;
  auVar81._0_8_ = auVar101._0_8_ ^ 0x8000000080000000;
  auVar81._8_4_ = auVar101._8_4_ ^ 0x80000000;
  auVar81._12_4_ = auVar101._12_4_ ^ 0x80000000;
  local_158._16_16_ = auVar81;
  local_158._0_16_ = auVar81;
  uVar74 = 0;
  uVar73 = 0;
  _local_1c8 = vsubps_avx(_local_2f8,_local_2e8);
  _local_1d8 = vsubps_avx(_local_308,_local_2f8);
  _local_1e8 = vsubps_avx(_local_408,_local_308);
  _local_208 = vsubps_avx(_local_378,_local_368);
  _local_218 = vsubps_avx(_local_3b8,_local_398);
  _local_228 = vsubps_avx(_local_288,_local_3a8);
  auVar66._4_4_ = fStack_3e4;
  auVar66._0_4_ = local_3e8;
  auVar66._8_4_ = fStack_3e0;
  auVar66._12_4_ = fStack_3dc;
  _local_238 = vsubps_avx(auVar66,_local_388);
  local_488 = ZEXT816(0x3f80000000000000);
  local_1f8 = local_488;
  do {
    auVar101 = vshufps_avx(local_488,local_488,0x50);
    auVar319._8_4_ = 0x3f800000;
    auVar319._0_8_ = &DAT_3f8000003f800000;
    auVar319._12_4_ = 0x3f800000;
    auVar324._16_4_ = 0x3f800000;
    auVar324._0_16_ = auVar319;
    auVar324._20_4_ = 0x3f800000;
    auVar324._24_4_ = 0x3f800000;
    auVar324._28_4_ = 0x3f800000;
    auVar240 = vsubps_avx(auVar319,auVar101);
    fVar182 = auVar101._0_4_;
    fVar199 = auVar101._4_4_;
    fVar200 = auVar101._8_4_;
    fVar201 = auVar101._12_4_;
    fVar202 = auVar240._0_4_;
    fVar203 = auVar240._4_4_;
    fVar204 = auVar240._8_4_;
    fVar131 = auVar240._12_4_;
    auVar117._0_4_ = auVar267._0_4_ * fVar182 + fVar202 * fVar159;
    auVar117._4_4_ = auVar267._4_4_ * fVar199 + fVar203 * fVar160;
    auVar117._8_4_ = auVar267._0_4_ * fVar200 + fVar204 * fVar159;
    auVar117._12_4_ = auVar267._4_4_ * fVar201 + fVar131 * fVar160;
    auVar96._0_4_ = local_338._0_4_ * fVar182 + auVar95._0_4_ * fVar202;
    auVar96._4_4_ = local_338._4_4_ * fVar199 + auVar95._4_4_ * fVar203;
    auVar96._8_4_ = local_338._8_4_ * fVar200 + auVar95._0_4_ * fVar204;
    auVar96._12_4_ = local_338._12_4_ * fVar201 + auVar95._4_4_ * fVar131;
    auVar226._0_4_ = local_348._0_4_ * fVar182 + auVar318._0_4_ * fVar202;
    auVar226._4_4_ = local_348._4_4_ * fVar199 + auVar318._4_4_ * fVar203;
    auVar226._8_4_ = local_348._8_4_ * fVar200 + auVar318._0_4_ * fVar204;
    auVar226._12_4_ = local_348._12_4_ * fVar201 + auVar318._4_4_ * fVar131;
    auVar136._0_4_ = local_358._0_4_ * fVar182 + auVar256._0_4_ * fVar202;
    auVar136._4_4_ = local_358._4_4_ * fVar199 + auVar256._4_4_ * fVar203;
    auVar136._8_4_ = local_358._8_4_ * fVar200 + auVar256._0_4_ * fVar204;
    auVar136._12_4_ = local_358._12_4_ * fVar201 + auVar256._4_4_ * fVar131;
    auVar101 = vmovshdup_avx(local_1f8);
    auVar240 = vshufps_avx(local_1f8,local_1f8,0);
    auVar252._16_16_ = auVar240;
    auVar252._0_16_ = auVar240;
    auVar22 = vshufps_avx(local_1f8,local_1f8,0x55);
    auVar89._16_16_ = auVar22;
    auVar89._0_16_ = auVar22;
    auVar84 = vsubps_avx(auVar89,auVar252);
    auVar22 = vshufps_avx(auVar117,auVar117,0);
    auVar196 = vshufps_avx(auVar117,auVar117,0x55);
    auVar143 = vshufps_avx(auVar96,auVar96,0);
    auVar100 = vshufps_avx(auVar96,auVar96,0x55);
    auVar142 = vshufps_avx(auVar226,auVar226,0);
    auVar82 = vshufps_avx(auVar226,auVar226,0x55);
    auVar118 = vshufps_avx(auVar136,auVar136,0);
    auVar241 = vshufps_avx(auVar136,auVar136,0x55);
    auVar101 = ZEXT416((uint)((auVar101._0_4_ - local_1f8._0_4_) * 0.04761905));
    auVar101 = vshufps_avx(auVar101,auVar101,0);
    auVar266._0_4_ = auVar240._0_4_ + auVar84._0_4_ * 0.0;
    auVar266._4_4_ = auVar240._4_4_ + auVar84._4_4_ * 0.14285715;
    auVar266._8_4_ = auVar240._8_4_ + auVar84._8_4_ * 0.2857143;
    auVar266._12_4_ = auVar240._12_4_ + auVar84._12_4_ * 0.42857146;
    auVar266._16_4_ = auVar240._0_4_ + auVar84._16_4_ * 0.5714286;
    auVar266._20_4_ = auVar240._4_4_ + auVar84._20_4_ * 0.71428573;
    auVar266._24_4_ = auVar240._8_4_ + auVar84._24_4_ * 0.8571429;
    auVar266._28_4_ = auVar240._12_4_ + auVar84._28_4_;
    auVar14 = vsubps_avx(auVar324,auVar266);
    fVar174 = auVar143._0_4_;
    fVar177 = auVar143._4_4_;
    fVar175 = auVar143._8_4_;
    fVar178 = auVar143._12_4_;
    fVar182 = auVar14._0_4_;
    fVar202 = auVar14._4_4_;
    fVar155 = auVar14._8_4_;
    fVar161 = auVar14._12_4_;
    fVar308 = auVar22._12_4_;
    fVar179 = auVar14._16_4_;
    fVar180 = auVar14._20_4_;
    fVar181 = auVar14._24_4_;
    fVar219 = auVar100._0_4_;
    fVar220 = auVar100._4_4_;
    fVar221 = auVar100._8_4_;
    fVar302 = auVar100._12_4_;
    local_428._0_4_ = auVar196._0_4_;
    local_428._4_4_ = auVar196._4_4_;
    fStack_420 = auVar196._8_4_;
    fStack_41c = auVar196._12_4_;
    fVar199 = auVar142._0_4_;
    fVar201 = auVar142._4_4_;
    fVar204 = auVar142._8_4_;
    fVar156 = auVar142._12_4_;
    fVar176 = auVar266._0_4_ * fVar199 + fVar174 * fVar182;
    fVar284 = auVar266._4_4_ * fVar201 + fVar177 * fVar202;
    fVar285 = auVar266._8_4_ * fVar204 + fVar175 * fVar155;
    fVar286 = auVar266._12_4_ * fVar156 + fVar178 * fVar161;
    fVar287 = auVar266._16_4_ * fVar199 + fVar174 * fVar179;
    fVar288 = auVar266._20_4_ * fVar201 + fVar177 * fVar180;
    fVar289 = auVar266._24_4_ * fVar204 + fVar175 * fVar181;
    fVar200 = auVar82._0_4_;
    fVar203 = auVar82._4_4_;
    fVar131 = auVar82._8_4_;
    fVar157 = auVar82._12_4_;
    fVar290 = auVar266._0_4_ * fVar200 + fVar219 * fVar182;
    fVar293 = auVar266._4_4_ * fVar203 + fVar220 * fVar202;
    fVar294 = auVar266._8_4_ * fVar131 + fVar221 * fVar155;
    fVar295 = auVar266._12_4_ * fVar157 + fVar302 * fVar161;
    fVar296 = auVar266._16_4_ * fVar200 + fVar219 * fVar179;
    fVar298 = auVar266._20_4_ * fVar203 + fVar220 * fVar180;
    fVar300 = auVar266._24_4_ * fVar131 + fVar221 * fVar181;
    auVar240 = vshufps_avx(auVar117,auVar117,0xaa);
    auVar196 = vshufps_avx(auVar117,auVar117,0xff);
    fVar158 = fVar156 + 0.0;
    auVar143 = vshufps_avx(auVar96,auVar96,0xaa);
    auVar100 = vshufps_avx(auVar96,auVar96,0xff);
    auVar90._0_4_ =
         fVar182 * (fVar174 * auVar266._0_4_ + auVar22._0_4_ * fVar182) + auVar266._0_4_ * fVar176;
    auVar90._4_4_ =
         fVar202 * (fVar177 * auVar266._4_4_ + auVar22._4_4_ * fVar202) + auVar266._4_4_ * fVar284;
    auVar90._8_4_ =
         fVar155 * (fVar175 * auVar266._8_4_ + auVar22._8_4_ * fVar155) + auVar266._8_4_ * fVar285;
    auVar90._12_4_ =
         fVar161 * (fVar178 * auVar266._12_4_ + fVar308 * fVar161) + auVar266._12_4_ * fVar286;
    auVar90._16_4_ =
         fVar179 * (fVar174 * auVar266._16_4_ + auVar22._0_4_ * fVar179) + auVar266._16_4_ * fVar287
    ;
    auVar90._20_4_ =
         fVar180 * (fVar177 * auVar266._20_4_ + auVar22._4_4_ * fVar180) + auVar266._20_4_ * fVar288
    ;
    auVar90._24_4_ =
         fVar181 * (fVar175 * auVar266._24_4_ + auVar22._8_4_ * fVar181) + auVar266._24_4_ * fVar289
    ;
    auVar90._28_4_ = fVar308 + 1.0 + fVar157;
    auVar151._0_4_ =
         fVar182 * (fVar219 * auVar266._0_4_ + fVar182 * (float)local_428._0_4_) +
         auVar266._0_4_ * fVar290;
    auVar151._4_4_ =
         fVar202 * (fVar220 * auVar266._4_4_ + fVar202 * (float)local_428._4_4_) +
         auVar266._4_4_ * fVar293;
    auVar151._8_4_ =
         fVar155 * (fVar221 * auVar266._8_4_ + fVar155 * fStack_420) + auVar266._8_4_ * fVar294;
    auVar151._12_4_ =
         fVar161 * (fVar302 * auVar266._12_4_ + fVar161 * fStack_41c) + auVar266._12_4_ * fVar295;
    auVar151._16_4_ =
         fVar179 * (fVar219 * auVar266._16_4_ + fVar179 * (float)local_428._0_4_) +
         auVar266._16_4_ * fVar296;
    auVar151._20_4_ =
         fVar180 * (fVar220 * auVar266._20_4_ + fVar180 * (float)local_428._4_4_) +
         auVar266._20_4_ * fVar298;
    auVar151._24_4_ =
         fVar181 * (fVar221 * auVar266._24_4_ + fVar181 * fStack_420) + auVar266._24_4_ * fVar300;
    auVar151._28_4_ = fVar308 + 1.0 + fVar157;
    auVar171._0_4_ =
         fVar182 * fVar176 + auVar266._0_4_ * (auVar118._0_4_ * auVar266._0_4_ + fVar182 * fVar199);
    auVar171._4_4_ =
         fVar202 * fVar284 + auVar266._4_4_ * (auVar118._4_4_ * auVar266._4_4_ + fVar202 * fVar201);
    auVar171._8_4_ =
         fVar155 * fVar285 + auVar266._8_4_ * (auVar118._8_4_ * auVar266._8_4_ + fVar155 * fVar204);
    auVar171._12_4_ =
         fVar161 * fVar286 +
         auVar266._12_4_ * (auVar118._12_4_ * auVar266._12_4_ + fVar161 * fVar156);
    auVar171._16_4_ =
         fVar179 * fVar287 +
         auVar266._16_4_ * (auVar118._0_4_ * auVar266._16_4_ + fVar179 * fVar199);
    auVar171._20_4_ =
         fVar180 * fVar288 +
         auVar266._20_4_ * (auVar118._4_4_ * auVar266._20_4_ + fVar180 * fVar201);
    auVar171._24_4_ =
         fVar181 * fVar289 +
         auVar266._24_4_ * (auVar118._8_4_ * auVar266._24_4_ + fVar181 * fVar204);
    auVar171._28_4_ = fVar157 + fVar158;
    auVar274._0_4_ =
         fVar182 * fVar290 + auVar266._0_4_ * (auVar241._0_4_ * auVar266._0_4_ + fVar182 * fVar200);
    auVar274._4_4_ =
         fVar202 * fVar293 + auVar266._4_4_ * (auVar241._4_4_ * auVar266._4_4_ + fVar202 * fVar203);
    auVar274._8_4_ =
         fVar155 * fVar294 + auVar266._8_4_ * (auVar241._8_4_ * auVar266._8_4_ + fVar155 * fVar131);
    auVar274._12_4_ =
         fVar161 * fVar295 +
         auVar266._12_4_ * (auVar241._12_4_ * auVar266._12_4_ + fVar161 * fVar157);
    auVar274._16_4_ =
         fVar179 * fVar296 +
         auVar266._16_4_ * (auVar241._0_4_ * auVar266._16_4_ + fVar179 * fVar200);
    auVar274._20_4_ =
         fVar180 * fVar298 +
         auVar266._20_4_ * (auVar241._4_4_ * auVar266._20_4_ + fVar180 * fVar203);
    auVar274._24_4_ =
         fVar181 * fVar300 +
         auVar266._24_4_ * (auVar241._8_4_ * auVar266._24_4_ + fVar181 * fVar131);
    auVar274._28_4_ = fVar158 + fVar157 + 0.0;
    local_78._0_4_ = fVar182 * auVar90._0_4_ + auVar266._0_4_ * auVar171._0_4_;
    local_78._4_4_ = fVar202 * auVar90._4_4_ + auVar266._4_4_ * auVar171._4_4_;
    local_78._8_4_ = fVar155 * auVar90._8_4_ + auVar266._8_4_ * auVar171._8_4_;
    local_78._12_4_ = fVar161 * auVar90._12_4_ + auVar266._12_4_ * auVar171._12_4_;
    local_78._16_4_ = fVar179 * auVar90._16_4_ + auVar266._16_4_ * auVar171._16_4_;
    local_78._20_4_ = fVar180 * auVar90._20_4_ + auVar266._20_4_ * auVar171._20_4_;
    local_78._24_4_ = fVar181 * auVar90._24_4_ + auVar266._24_4_ * auVar171._24_4_;
    local_78._28_4_ = fVar308 + fVar178 + fVar157 + 0.0;
    local_98._0_4_ = fVar182 * auVar151._0_4_ + auVar266._0_4_ * auVar274._0_4_;
    local_98._4_4_ = fVar202 * auVar151._4_4_ + auVar266._4_4_ * auVar274._4_4_;
    local_98._8_4_ = fVar155 * auVar151._8_4_ + auVar266._8_4_ * auVar274._8_4_;
    local_98._12_4_ = fVar161 * auVar151._12_4_ + auVar266._12_4_ * auVar274._12_4_;
    local_98._16_4_ = fVar179 * auVar151._16_4_ + auVar266._16_4_ * auVar274._16_4_;
    local_98._20_4_ = fVar180 * auVar151._20_4_ + auVar266._20_4_ * auVar274._20_4_;
    local_98._24_4_ = fVar181 * auVar151._24_4_ + auVar266._24_4_ * auVar274._24_4_;
    local_98._28_4_ = fVar308 + fVar178 + fVar158;
    auVar15 = vsubps_avx(auVar171,auVar90);
    auVar84 = vsubps_avx(auVar274,auVar151);
    local_3d8._0_4_ = auVar101._0_4_;
    local_3d8._4_4_ = auVar101._4_4_;
    fStack_3d0 = auVar101._8_4_;
    fStack_3cc = auVar101._12_4_;
    local_d8 = (float)local_3d8._0_4_ * auVar15._0_4_ * 3.0;
    fStack_d4 = (float)local_3d8._4_4_ * auVar15._4_4_ * 3.0;
    auVar25._4_4_ = fStack_d4;
    auVar25._0_4_ = local_d8;
    fStack_d0 = fStack_3d0 * auVar15._8_4_ * 3.0;
    auVar25._8_4_ = fStack_d0;
    fStack_cc = fStack_3cc * auVar15._12_4_ * 3.0;
    auVar25._12_4_ = fStack_cc;
    fStack_c8 = (float)local_3d8._0_4_ * auVar15._16_4_ * 3.0;
    auVar25._16_4_ = fStack_c8;
    fStack_c4 = (float)local_3d8._4_4_ * auVar15._20_4_ * 3.0;
    auVar25._20_4_ = fStack_c4;
    fStack_c0 = fStack_3d0 * auVar15._24_4_ * 3.0;
    auVar25._24_4_ = fStack_c0;
    auVar25._28_4_ = auVar15._28_4_;
    fVar284 = (float)local_3d8._0_4_ * auVar84._0_4_ * 3.0;
    fVar175 = (float)local_3d8._4_4_ * auVar84._4_4_ * 3.0;
    auVar26._4_4_ = fVar175;
    auVar26._0_4_ = fVar284;
    fVar285 = fStack_3d0 * auVar84._8_4_ * 3.0;
    auVar26._8_4_ = fVar285;
    fVar178 = fStack_3cc * auVar84._12_4_ * 3.0;
    auVar26._12_4_ = fVar178;
    fVar286 = (float)local_3d8._0_4_ * auVar84._16_4_ * 3.0;
    auVar26._16_4_ = fVar286;
    fVar287 = (float)local_3d8._4_4_ * auVar84._20_4_ * 3.0;
    auVar26._20_4_ = fVar287;
    fVar288 = fStack_3d0 * auVar84._24_4_ * 3.0;
    auVar26._24_4_ = fVar288;
    auVar26._28_4_ = auVar171._28_4_;
    auVar16 = vsubps_avx(local_78,auVar25);
    auVar84 = vperm2f128_avx(auVar16,auVar16,1);
    auVar84 = vshufps_avx(auVar84,auVar16,0x30);
    _local_428 = vshufps_avx(auVar16,auVar84,0x29);
    auVar16 = vsubps_avx(local_98,auVar26);
    auVar84 = vperm2f128_avx(auVar16,auVar16,1);
    auVar84 = vshufps_avx(auVar84,auVar16,0x30);
    _local_468 = vshufps_avx(auVar16,auVar84,0x29);
    fVar310 = auVar143._0_4_;
    fVar314 = auVar143._4_4_;
    fVar315 = auVar143._8_4_;
    fVar199 = auVar100._0_4_;
    fVar203 = auVar100._4_4_;
    fVar156 = auVar100._8_4_;
    fVar174 = auVar100._12_4_;
    fVar309 = auVar196._12_4_;
    auVar101 = vshufps_avx(auVar226,auVar226,0xaa);
    fVar200 = auVar101._0_4_;
    fVar204 = auVar101._4_4_;
    fVar157 = auVar101._8_4_;
    fVar176 = auVar101._12_4_;
    fVar295 = auVar266._0_4_ * fVar200 + fVar310 * fVar182;
    fVar296 = auVar266._4_4_ * fVar204 + fVar314 * fVar202;
    fVar298 = auVar266._8_4_ * fVar157 + fVar315 * fVar155;
    fVar300 = auVar266._12_4_ * fVar176 + auVar143._12_4_ * fVar161;
    fVar297 = auVar266._16_4_ * fVar200 + fVar310 * fVar179;
    fVar299 = auVar266._20_4_ * fVar204 + fVar314 * fVar180;
    fVar301 = auVar266._24_4_ * fVar157 + fVar315 * fVar181;
    fVar302 = fVar309 + fVar308 + fVar302;
    auVar101 = vshufps_avx(auVar226,auVar226,0xff);
    fVar201 = auVar101._0_4_;
    fVar131 = auVar101._4_4_;
    fVar158 = auVar101._8_4_;
    fVar177 = auVar101._12_4_;
    fVar289 = auVar266._0_4_ * fVar201 + fVar182 * fVar199;
    fVar219 = auVar266._4_4_ * fVar131 + fVar202 * fVar203;
    fVar290 = auVar266._8_4_ * fVar158 + fVar155 * fVar156;
    fVar220 = auVar266._12_4_ * fVar177 + fVar161 * fVar174;
    fVar293 = auVar266._16_4_ * fVar201 + fVar179 * fVar199;
    fVar221 = auVar266._20_4_ * fVar131 + fVar180 * fVar203;
    fVar294 = auVar266._24_4_ * fVar158 + fVar181 * fVar156;
    auVar101 = vshufps_avx(auVar136,auVar136,0xaa);
    auVar22 = vshufps_avx(auVar136,auVar136,0xff);
    fVar308 = auVar22._12_4_;
    auVar91._0_4_ =
         auVar266._0_4_ * fVar295 + fVar182 * (fVar310 * auVar266._0_4_ + auVar240._0_4_ * fVar182);
    auVar91._4_4_ =
         auVar266._4_4_ * fVar296 + fVar202 * (fVar314 * auVar266._4_4_ + auVar240._4_4_ * fVar202);
    auVar91._8_4_ =
         auVar266._8_4_ * fVar298 + fVar155 * (fVar315 * auVar266._8_4_ + auVar240._8_4_ * fVar155);
    auVar91._12_4_ =
         auVar266._12_4_ * fVar300 +
         fVar161 * (auVar143._12_4_ * auVar266._12_4_ + auVar240._12_4_ * fVar161);
    auVar91._16_4_ =
         auVar266._16_4_ * fVar297 +
         fVar179 * (fVar310 * auVar266._16_4_ + auVar240._0_4_ * fVar179);
    auVar91._20_4_ =
         auVar266._20_4_ * fVar299 +
         fVar180 * (fVar314 * auVar266._20_4_ + auVar240._4_4_ * fVar180);
    auVar91._24_4_ =
         auVar266._24_4_ * fVar301 +
         fVar181 * (fVar315 * auVar266._24_4_ + auVar240._8_4_ * fVar181);
    auVar91._28_4_ = fVar308 + auVar16._28_4_ + auVar84._28_4_;
    auVar307._0_4_ =
         auVar266._0_4_ * fVar289 + fVar182 * (auVar266._0_4_ * fVar199 + auVar196._0_4_ * fVar182);
    auVar307._4_4_ =
         auVar266._4_4_ * fVar219 + fVar202 * (auVar266._4_4_ * fVar203 + auVar196._4_4_ * fVar202);
    auVar307._8_4_ =
         auVar266._8_4_ * fVar290 + fVar155 * (auVar266._8_4_ * fVar156 + auVar196._8_4_ * fVar155);
    auVar307._12_4_ =
         auVar266._12_4_ * fVar220 + fVar161 * (auVar266._12_4_ * fVar174 + fVar309 * fVar161);
    auVar307._16_4_ =
         auVar266._16_4_ * fVar293 +
         fVar179 * (auVar266._16_4_ * fVar199 + auVar196._0_4_ * fVar179);
    auVar307._20_4_ =
         auVar266._20_4_ * fVar221 +
         fVar180 * (auVar266._20_4_ * fVar203 + auVar196._4_4_ * fVar180);
    auVar307._24_4_ =
         auVar266._24_4_ * fVar294 +
         fVar181 * (auVar266._24_4_ * fVar156 + auVar196._8_4_ * fVar181);
    auVar307._28_4_ = fVar308 + auVar84._28_4_ + auVar171._28_4_;
    auVar84 = vperm2f128_avx(local_78,local_78,1);
    auVar84 = vshufps_avx(auVar84,local_78,0x30);
    _local_328 = vshufps_avx(local_78,auVar84,0x29);
    auVar172._0_4_ =
         fVar182 * fVar295 + auVar266._0_4_ * (auVar101._0_4_ * auVar266._0_4_ + fVar182 * fVar200);
    auVar172._4_4_ =
         fVar202 * fVar296 + auVar266._4_4_ * (auVar101._4_4_ * auVar266._4_4_ + fVar202 * fVar204);
    auVar172._8_4_ =
         fVar155 * fVar298 + auVar266._8_4_ * (auVar101._8_4_ * auVar266._8_4_ + fVar155 * fVar157);
    auVar172._12_4_ =
         fVar161 * fVar300 +
         auVar266._12_4_ * (auVar101._12_4_ * auVar266._12_4_ + fVar161 * fVar176);
    auVar172._16_4_ =
         fVar179 * fVar297 +
         auVar266._16_4_ * (auVar101._0_4_ * auVar266._16_4_ + fVar179 * fVar200);
    auVar172._20_4_ =
         fVar180 * fVar299 +
         auVar266._20_4_ * (auVar101._4_4_ * auVar266._20_4_ + fVar180 * fVar204);
    auVar172._24_4_ =
         fVar181 * fVar301 +
         auVar266._24_4_ * (auVar101._8_4_ * auVar266._24_4_ + fVar181 * fVar157);
    auVar172._28_4_ = fVar302 + auVar101._12_4_ + fVar176;
    auVar218._0_4_ =
         fVar182 * fVar289 + auVar266._0_4_ * (auVar22._0_4_ * auVar266._0_4_ + fVar182 * fVar201);
    auVar218._4_4_ =
         fVar202 * fVar219 + auVar266._4_4_ * (auVar22._4_4_ * auVar266._4_4_ + fVar202 * fVar131);
    auVar218._8_4_ =
         fVar155 * fVar290 + auVar266._8_4_ * (auVar22._8_4_ * auVar266._8_4_ + fVar155 * fVar158);
    auVar218._12_4_ =
         fVar161 * fVar220 + auVar266._12_4_ * (fVar308 * auVar266._12_4_ + fVar161 * fVar177);
    auVar218._16_4_ =
         fVar179 * fVar293 + auVar266._16_4_ * (auVar22._0_4_ * auVar266._16_4_ + fVar179 * fVar201)
    ;
    auVar218._20_4_ =
         fVar180 * fVar221 + auVar266._20_4_ * (auVar22._4_4_ * auVar266._20_4_ + fVar180 * fVar131)
    ;
    auVar218._24_4_ =
         fVar181 * fVar294 + auVar266._24_4_ * (auVar22._8_4_ * auVar266._24_4_ + fVar181 * fVar158)
    ;
    auVar218._28_4_ = fVar309 + fVar174 + fVar308 + fVar177;
    auVar235._0_4_ = fVar182 * auVar91._0_4_ + auVar266._0_4_ * auVar172._0_4_;
    auVar235._4_4_ = fVar202 * auVar91._4_4_ + auVar266._4_4_ * auVar172._4_4_;
    auVar235._8_4_ = fVar155 * auVar91._8_4_ + auVar266._8_4_ * auVar172._8_4_;
    auVar235._12_4_ = fVar161 * auVar91._12_4_ + auVar266._12_4_ * auVar172._12_4_;
    auVar235._16_4_ = fVar179 * auVar91._16_4_ + auVar266._16_4_ * auVar172._16_4_;
    auVar235._20_4_ = fVar180 * auVar91._20_4_ + auVar266._20_4_ * auVar172._20_4_;
    auVar235._24_4_ = fVar181 * auVar91._24_4_ + auVar266._24_4_ * auVar172._24_4_;
    auVar235._28_4_ = fVar302 + fVar308 + fVar177;
    auVar253._0_4_ = fVar182 * auVar307._0_4_ + auVar266._0_4_ * auVar218._0_4_;
    auVar253._4_4_ = fVar202 * auVar307._4_4_ + auVar266._4_4_ * auVar218._4_4_;
    auVar253._8_4_ = fVar155 * auVar307._8_4_ + auVar266._8_4_ * auVar218._8_4_;
    auVar253._12_4_ = fVar161 * auVar307._12_4_ + auVar266._12_4_ * auVar218._12_4_;
    auVar253._16_4_ = fVar179 * auVar307._16_4_ + auVar266._16_4_ * auVar218._16_4_;
    auVar253._20_4_ = fVar180 * auVar307._20_4_ + auVar266._20_4_ * auVar218._20_4_;
    auVar253._24_4_ = fVar181 * auVar307._24_4_ + auVar266._24_4_ * auVar218._24_4_;
    auVar253._28_4_ = auVar14._28_4_ + auVar266._28_4_;
    auVar84 = vsubps_avx(auVar172,auVar91);
    auVar14 = vsubps_avx(auVar218,auVar307);
    local_f8 = (float)local_3d8._0_4_ * auVar84._0_4_ * 3.0;
    fStack_f4 = (float)local_3d8._4_4_ * auVar84._4_4_ * 3.0;
    auVar27._4_4_ = fStack_f4;
    auVar27._0_4_ = local_f8;
    fStack_f0 = fStack_3d0 * auVar84._8_4_ * 3.0;
    auVar27._8_4_ = fStack_f0;
    fStack_ec = fStack_3cc * auVar84._12_4_ * 3.0;
    auVar27._12_4_ = fStack_ec;
    fStack_e8 = (float)local_3d8._0_4_ * auVar84._16_4_ * 3.0;
    auVar27._16_4_ = fStack_e8;
    fStack_e4 = (float)local_3d8._4_4_ * auVar84._20_4_ * 3.0;
    auVar27._20_4_ = fStack_e4;
    fStack_e0 = fStack_3d0 * auVar84._24_4_ * 3.0;
    auVar27._24_4_ = fStack_e0;
    auVar27._28_4_ = auVar218._28_4_;
    local_118 = (float)local_3d8._0_4_ * auVar14._0_4_ * 3.0;
    fStack_114 = (float)local_3d8._4_4_ * auVar14._4_4_ * 3.0;
    auVar28._4_4_ = fStack_114;
    auVar28._0_4_ = local_118;
    fStack_110 = fStack_3d0 * auVar14._8_4_ * 3.0;
    auVar28._8_4_ = fStack_110;
    fStack_10c = fStack_3cc * auVar14._12_4_ * 3.0;
    auVar28._12_4_ = fStack_10c;
    fStack_108 = (float)local_3d8._0_4_ * auVar14._16_4_ * 3.0;
    auVar28._16_4_ = fStack_108;
    fStack_104 = (float)local_3d8._4_4_ * auVar14._20_4_ * 3.0;
    auVar28._20_4_ = fStack_104;
    fStack_3d0 = fStack_3d0 * auVar14._24_4_ * 3.0;
    auVar28._24_4_ = fStack_3d0;
    auVar28._28_4_ = fStack_3cc;
    auVar84 = vperm2f128_avx(auVar235,auVar235,1);
    auVar84 = vshufps_avx(auVar84,auVar235,0x30);
    auVar18 = vshufps_avx(auVar235,auVar84,0x29);
    auVar14 = vsubps_avx(auVar235,auVar27);
    auVar84 = vperm2f128_avx(auVar14,auVar14,1);
    auVar84 = vshufps_avx(auVar84,auVar14,0x30);
    auVar19 = vshufps_avx(auVar14,auVar84,0x29);
    auVar14 = vsubps_avx(auVar253,auVar28);
    auVar84 = vperm2f128_avx(auVar14,auVar14,1);
    auVar84 = vshufps_avx(auVar84,auVar14,0x30);
    auVar20 = vshufps_avx(auVar14,auVar84,0x29);
    auVar16 = vsubps_avx(auVar235,local_78);
    auVar17 = vsubps_avx(auVar18,_local_328);
    fVar182 = auVar17._0_4_ + auVar16._0_4_;
    fVar199 = auVar17._4_4_ + auVar16._4_4_;
    fVar200 = auVar17._8_4_ + auVar16._8_4_;
    fVar201 = auVar17._12_4_ + auVar16._12_4_;
    fVar202 = auVar17._16_4_ + auVar16._16_4_;
    fVar203 = auVar17._20_4_ + auVar16._20_4_;
    fVar204 = auVar17._24_4_ + auVar16._24_4_;
    auVar14 = vperm2f128_avx(local_98,local_98,1);
    auVar14 = vshufps_avx(auVar14,local_98,0x30);
    local_b8 = vshufps_avx(local_98,auVar14,0x29);
    auVar14 = vperm2f128_avx(auVar253,auVar253,1);
    auVar14 = vshufps_avx(auVar14,auVar253,0x30);
    auVar21 = vshufps_avx(auVar253,auVar14,0x29);
    auVar14 = vsubps_avx(auVar253,local_98);
    auVar23 = vsubps_avx(auVar21,local_b8);
    fVar131 = auVar14._0_4_ + auVar23._0_4_;
    fVar155 = auVar14._4_4_ + auVar23._4_4_;
    fVar156 = auVar14._8_4_ + auVar23._8_4_;
    fVar157 = auVar14._12_4_ + auVar23._12_4_;
    fVar158 = auVar14._16_4_ + auVar23._16_4_;
    fVar161 = auVar14._20_4_ + auVar23._20_4_;
    fVar174 = auVar14._24_4_ + auVar23._24_4_;
    fVar176 = auVar14._28_4_;
    auVar29._4_4_ = local_98._4_4_ * fVar199;
    auVar29._0_4_ = local_98._0_4_ * fVar182;
    auVar29._8_4_ = local_98._8_4_ * fVar200;
    auVar29._12_4_ = local_98._12_4_ * fVar201;
    auVar29._16_4_ = local_98._16_4_ * fVar202;
    auVar29._20_4_ = local_98._20_4_ * fVar203;
    auVar29._24_4_ = local_98._24_4_ * fVar204;
    auVar29._28_4_ = fVar176;
    auVar30._4_4_ = fVar155 * local_78._4_4_;
    auVar30._0_4_ = fVar131 * local_78._0_4_;
    auVar30._8_4_ = fVar156 * local_78._8_4_;
    auVar30._12_4_ = fVar157 * local_78._12_4_;
    auVar30._16_4_ = fVar158 * local_78._16_4_;
    auVar30._20_4_ = fVar161 * local_78._20_4_;
    auVar30._24_4_ = fVar174 * local_78._24_4_;
    auVar30._28_4_ = auVar84._28_4_;
    auVar84 = vsubps_avx(auVar29,auVar30);
    local_d8 = local_78._0_4_ + local_d8;
    fStack_d4 = local_78._4_4_ + fStack_d4;
    fStack_d0 = local_78._8_4_ + fStack_d0;
    fStack_cc = local_78._12_4_ + fStack_cc;
    fStack_c8 = local_78._16_4_ + fStack_c8;
    fStack_c4 = local_78._20_4_ + fStack_c4;
    fStack_c0 = local_78._24_4_ + fStack_c0;
    fStack_bc = local_78._28_4_ + auVar15._28_4_;
    fVar284 = local_98._0_4_ + fVar284;
    fVar175 = local_98._4_4_ + fVar175;
    fVar285 = local_98._8_4_ + fVar285;
    fVar178 = local_98._12_4_ + fVar178;
    fVar286 = local_98._16_4_ + fVar286;
    fVar287 = local_98._20_4_ + fVar287;
    fVar288 = local_98._24_4_ + fVar288;
    auVar31._4_4_ = fVar175 * fVar199;
    auVar31._0_4_ = fVar284 * fVar182;
    auVar31._8_4_ = fVar285 * fVar200;
    auVar31._12_4_ = fVar178 * fVar201;
    auVar31._16_4_ = fVar286 * fVar202;
    auVar31._20_4_ = fVar287 * fVar203;
    auVar31._24_4_ = fVar288 * fVar204;
    auVar31._28_4_ = fVar176;
    auVar32._4_4_ = fVar155 * fStack_d4;
    auVar32._0_4_ = fVar131 * local_d8;
    auVar32._8_4_ = fVar156 * fStack_d0;
    auVar32._12_4_ = fVar157 * fStack_cc;
    auVar32._16_4_ = fVar158 * fStack_c8;
    auVar32._20_4_ = fVar161 * fStack_c4;
    auVar32._24_4_ = fVar174 * fStack_c0;
    auVar32._28_4_ = fStack_bc;
    auVar15 = vsubps_avx(auVar31,auVar32);
    auVar33._4_4_ = local_468._4_4_ * fVar199;
    auVar33._0_4_ = local_468._0_4_ * fVar182;
    auVar33._8_4_ = local_468._8_4_ * fVar200;
    auVar33._12_4_ = local_468._12_4_ * fVar201;
    auVar33._16_4_ = local_468._16_4_ * fVar202;
    auVar33._20_4_ = local_468._20_4_ * fVar203;
    auVar33._24_4_ = local_468._24_4_ * fVar204;
    auVar33._28_4_ = fVar176;
    auVar34._4_4_ = fVar155 * (float)local_428._4_4_;
    auVar34._0_4_ = fVar131 * (float)local_428._0_4_;
    auVar34._8_4_ = fVar156 * fStack_420;
    auVar34._12_4_ = fVar157 * fStack_41c;
    auVar34._16_4_ = fVar158 * fStack_418;
    auVar34._20_4_ = fVar161 * fStack_414;
    auVar34._24_4_ = fVar174 * fStack_410;
    auVar34._28_4_ = 0x40400000;
    auVar24 = vsubps_avx(auVar33,auVar34);
    auVar35._4_4_ = local_b8._4_4_ * fVar199;
    auVar35._0_4_ = local_b8._0_4_ * fVar182;
    auVar35._8_4_ = local_b8._8_4_ * fVar200;
    auVar35._12_4_ = local_b8._12_4_ * fVar201;
    auVar35._16_4_ = local_b8._16_4_ * fVar202;
    auVar35._20_4_ = local_b8._20_4_ * fVar203;
    auVar35._24_4_ = local_b8._24_4_ * fVar204;
    auVar35._28_4_ = fVar176;
    auVar36._4_4_ = local_328._4_4_ * fVar155;
    auVar36._0_4_ = local_328._0_4_ * fVar131;
    auVar36._8_4_ = local_328._8_4_ * fVar156;
    auVar36._12_4_ = local_328._12_4_ * fVar157;
    auVar36._16_4_ = local_328._16_4_ * fVar158;
    auVar36._20_4_ = local_328._20_4_ * fVar161;
    auVar36._24_4_ = local_328._24_4_ * fVar174;
    auVar36._28_4_ = local_b8._28_4_;
    auVar85 = vsubps_avx(auVar35,auVar36);
    auVar37._4_4_ = auVar253._4_4_ * fVar199;
    auVar37._0_4_ = auVar253._0_4_ * fVar182;
    auVar37._8_4_ = auVar253._8_4_ * fVar200;
    auVar37._12_4_ = auVar253._12_4_ * fVar201;
    auVar37._16_4_ = auVar253._16_4_ * fVar202;
    auVar37._20_4_ = auVar253._20_4_ * fVar203;
    auVar37._24_4_ = auVar253._24_4_ * fVar204;
    auVar37._28_4_ = fVar176;
    auVar38._4_4_ = fVar155 * auVar235._4_4_;
    auVar38._0_4_ = fVar131 * auVar235._0_4_;
    auVar38._8_4_ = fVar156 * auVar235._8_4_;
    auVar38._12_4_ = fVar157 * auVar235._12_4_;
    auVar38._16_4_ = fVar158 * auVar235._16_4_;
    auVar38._20_4_ = fVar161 * auVar235._20_4_;
    auVar38._24_4_ = fVar174 * auVar235._24_4_;
    auVar38._28_4_ = local_468._28_4_;
    auVar86 = vsubps_avx(auVar37,auVar38);
    local_f8 = auVar235._0_4_ + local_f8;
    fStack_f4 = auVar235._4_4_ + fStack_f4;
    fStack_f0 = auVar235._8_4_ + fStack_f0;
    fStack_ec = auVar235._12_4_ + fStack_ec;
    fStack_e8 = auVar235._16_4_ + fStack_e8;
    fStack_e4 = auVar235._20_4_ + fStack_e4;
    fStack_e0 = auVar235._24_4_ + fStack_e0;
    fStack_dc = auVar235._28_4_ + auVar218._28_4_;
    local_118 = auVar253._0_4_ + local_118;
    fStack_114 = auVar253._4_4_ + fStack_114;
    fStack_110 = auVar253._8_4_ + fStack_110;
    fStack_10c = auVar253._12_4_ + fStack_10c;
    fStack_108 = auVar253._16_4_ + fStack_108;
    fStack_104 = auVar253._20_4_ + fStack_104;
    fStack_100 = auVar253._24_4_ + fStack_3d0;
    fStack_fc = auVar253._28_4_ + fStack_3cc;
    auVar39._4_4_ = fStack_114 * fVar199;
    auVar39._0_4_ = local_118 * fVar182;
    auVar39._8_4_ = fStack_110 * fVar200;
    auVar39._12_4_ = fStack_10c * fVar201;
    auVar39._16_4_ = fStack_108 * fVar202;
    auVar39._20_4_ = fStack_104 * fVar203;
    auVar39._24_4_ = fStack_100 * fVar204;
    auVar39._28_4_ = auVar253._28_4_ + fStack_3cc;
    auVar40._4_4_ = fStack_f4 * fVar155;
    auVar40._0_4_ = local_f8 * fVar131;
    auVar40._8_4_ = fStack_f0 * fVar156;
    auVar40._12_4_ = fStack_ec * fVar157;
    auVar40._16_4_ = fStack_e8 * fVar158;
    auVar40._20_4_ = fStack_e4 * fVar161;
    auVar40._24_4_ = fStack_e0 * fVar174;
    auVar40._28_4_ = fStack_dc;
    auVar87 = vsubps_avx(auVar39,auVar40);
    auVar41._4_4_ = auVar20._4_4_ * fVar199;
    auVar41._0_4_ = auVar20._0_4_ * fVar182;
    auVar41._8_4_ = auVar20._8_4_ * fVar200;
    auVar41._12_4_ = auVar20._12_4_ * fVar201;
    auVar41._16_4_ = auVar20._16_4_ * fVar202;
    auVar41._20_4_ = auVar20._20_4_ * fVar203;
    auVar41._24_4_ = auVar20._24_4_ * fVar204;
    auVar41._28_4_ = fStack_dc;
    auVar42._4_4_ = fVar155 * auVar19._4_4_;
    auVar42._0_4_ = fVar131 * auVar19._0_4_;
    auVar42._8_4_ = fVar156 * auVar19._8_4_;
    auVar42._12_4_ = fVar157 * auVar19._12_4_;
    auVar42._16_4_ = fVar158 * auVar19._16_4_;
    auVar42._20_4_ = fVar161 * auVar19._20_4_;
    auVar42._24_4_ = fVar174 * auVar19._24_4_;
    auVar42._28_4_ = auVar19._28_4_;
    auVar110 = vsubps_avx(auVar41,auVar42);
    auVar43._4_4_ = auVar21._4_4_ * fVar199;
    auVar43._0_4_ = auVar21._0_4_ * fVar182;
    auVar43._8_4_ = auVar21._8_4_ * fVar200;
    auVar43._12_4_ = auVar21._12_4_ * fVar201;
    auVar43._16_4_ = auVar21._16_4_ * fVar202;
    auVar43._20_4_ = auVar21._20_4_ * fVar203;
    auVar43._24_4_ = auVar21._24_4_ * fVar204;
    auVar43._28_4_ = auVar17._28_4_ + auVar16._28_4_;
    auVar44._4_4_ = auVar18._4_4_ * fVar155;
    auVar44._0_4_ = auVar18._0_4_ * fVar131;
    auVar44._8_4_ = auVar18._8_4_ * fVar156;
    auVar44._12_4_ = auVar18._12_4_ * fVar157;
    auVar44._16_4_ = auVar18._16_4_ * fVar158;
    auVar44._20_4_ = auVar18._20_4_ * fVar161;
    auVar44._24_4_ = auVar18._24_4_ * fVar174;
    auVar44._28_4_ = fVar176 + auVar23._28_4_;
    auVar23 = vsubps_avx(auVar43,auVar44);
    auVar14 = vminps_avx(auVar84,auVar15);
    auVar84 = vmaxps_avx(auVar84,auVar15);
    auVar15 = vminps_avx(auVar24,auVar85);
    auVar15 = vminps_avx(auVar14,auVar15);
    auVar14 = vmaxps_avx(auVar24,auVar85);
    auVar84 = vmaxps_avx(auVar84,auVar14);
    auVar16 = vminps_avx(auVar86,auVar87);
    auVar14 = vmaxps_avx(auVar86,auVar87);
    auVar17 = vminps_avx(auVar110,auVar23);
    auVar16 = vminps_avx(auVar16,auVar17);
    auVar16 = vminps_avx(auVar15,auVar16);
    auVar15 = vmaxps_avx(auVar110,auVar23);
    auVar14 = vmaxps_avx(auVar14,auVar15);
    auVar14 = vmaxps_avx(auVar84,auVar14);
    auVar84 = vcmpps_avx(auVar16,local_138,2);
    auVar14 = vcmpps_avx(auVar14,local_158,5);
    auVar84 = vandps_avx(auVar14,auVar84);
    auVar14 = local_1b8 & auVar84;
    uVar69 = 0;
    if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar14 >> 0x7f,0) != '\0') ||
          (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar14 >> 0xbf,0) != '\0') ||
        (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar14[0x1f] < '\0')
    {
      auVar14 = vsubps_avx(_local_328,local_78);
      auVar15 = vsubps_avx(auVar18,auVar235);
      fVar199 = auVar14._0_4_ + auVar15._0_4_;
      fVar200 = auVar14._4_4_ + auVar15._4_4_;
      fVar201 = auVar14._8_4_ + auVar15._8_4_;
      fVar202 = auVar14._12_4_ + auVar15._12_4_;
      fVar203 = auVar14._16_4_ + auVar15._16_4_;
      fVar204 = auVar14._20_4_ + auVar15._20_4_;
      fVar131 = auVar14._24_4_ + auVar15._24_4_;
      auVar16 = vsubps_avx(local_b8,local_98);
      auVar17 = vsubps_avx(auVar21,auVar253);
      fVar155 = auVar16._0_4_ + auVar17._0_4_;
      fVar156 = auVar16._4_4_ + auVar17._4_4_;
      fVar157 = auVar16._8_4_ + auVar17._8_4_;
      fVar158 = auVar16._12_4_ + auVar17._12_4_;
      fVar161 = auVar16._16_4_ + auVar17._16_4_;
      fVar174 = auVar16._20_4_ + auVar17._20_4_;
      fVar176 = auVar16._24_4_ + auVar17._24_4_;
      fVar182 = auVar17._28_4_;
      auVar45._4_4_ = local_98._4_4_ * fVar200;
      auVar45._0_4_ = local_98._0_4_ * fVar199;
      auVar45._8_4_ = local_98._8_4_ * fVar201;
      auVar45._12_4_ = local_98._12_4_ * fVar202;
      auVar45._16_4_ = local_98._16_4_ * fVar203;
      auVar45._20_4_ = local_98._20_4_ * fVar204;
      auVar45._24_4_ = local_98._24_4_ * fVar131;
      auVar45._28_4_ = local_98._28_4_;
      auVar46._4_4_ = local_78._4_4_ * fVar156;
      auVar46._0_4_ = local_78._0_4_ * fVar155;
      auVar46._8_4_ = local_78._8_4_ * fVar157;
      auVar46._12_4_ = local_78._12_4_ * fVar158;
      auVar46._16_4_ = local_78._16_4_ * fVar161;
      auVar46._20_4_ = local_78._20_4_ * fVar174;
      auVar46._24_4_ = local_78._24_4_ * fVar176;
      auVar46._28_4_ = local_78._28_4_;
      auVar17 = vsubps_avx(auVar45,auVar46);
      auVar47._4_4_ = fVar175 * fVar200;
      auVar47._0_4_ = fVar284 * fVar199;
      auVar47._8_4_ = fVar285 * fVar201;
      auVar47._12_4_ = fVar178 * fVar202;
      auVar47._16_4_ = fVar286 * fVar203;
      auVar47._20_4_ = fVar287 * fVar204;
      auVar47._24_4_ = fVar288 * fVar131;
      auVar47._28_4_ = local_98._28_4_;
      auVar48._4_4_ = fVar156 * fStack_d4;
      auVar48._0_4_ = fVar155 * local_d8;
      auVar48._8_4_ = fVar157 * fStack_d0;
      auVar48._12_4_ = fVar158 * fStack_cc;
      auVar48._16_4_ = fVar161 * fStack_c8;
      auVar48._20_4_ = fVar174 * fStack_c4;
      auVar48._24_4_ = fVar176 * fStack_c0;
      auVar48._28_4_ = fVar182;
      auVar23 = vsubps_avx(auVar47,auVar48);
      auVar49._4_4_ = fVar200 * local_468._4_4_;
      auVar49._0_4_ = fVar199 * local_468._0_4_;
      auVar49._8_4_ = fVar201 * local_468._8_4_;
      auVar49._12_4_ = fVar202 * local_468._12_4_;
      auVar49._16_4_ = fVar203 * local_468._16_4_;
      auVar49._20_4_ = fVar204 * local_468._20_4_;
      auVar49._24_4_ = fVar131 * local_468._24_4_;
      auVar49._28_4_ = fVar182;
      auVar50._4_4_ = fVar156 * (float)local_428._4_4_;
      auVar50._0_4_ = fVar155 * (float)local_428._0_4_;
      auVar50._8_4_ = fVar157 * fStack_420;
      auVar50._12_4_ = fVar158 * fStack_41c;
      auVar50._16_4_ = fVar161 * fStack_418;
      auVar50._20_4_ = fVar174 * fStack_414;
      auVar50._24_4_ = fVar176 * fStack_410;
      auVar50._28_4_ = local_98._28_4_ + auVar171._28_4_;
      auVar24 = vsubps_avx(auVar49,auVar50);
      auVar51._4_4_ = local_b8._4_4_ * fVar200;
      auVar51._0_4_ = local_b8._0_4_ * fVar199;
      auVar51._8_4_ = local_b8._8_4_ * fVar201;
      auVar51._12_4_ = local_b8._12_4_ * fVar202;
      auVar51._16_4_ = local_b8._16_4_ * fVar203;
      auVar51._20_4_ = local_b8._20_4_ * fVar204;
      auVar51._24_4_ = local_b8._24_4_ * fVar131;
      auVar51._28_4_ = local_98._28_4_ + auVar171._28_4_;
      auVar52._4_4_ = local_328._4_4_ * fVar156;
      auVar52._0_4_ = local_328._0_4_ * fVar155;
      auVar52._8_4_ = local_328._8_4_ * fVar157;
      auVar52._12_4_ = local_328._12_4_ * fVar158;
      auVar52._16_4_ = local_328._16_4_ * fVar161;
      auVar52._20_4_ = local_328._20_4_ * fVar174;
      uVar3 = local_328._28_4_;
      auVar52._24_4_ = local_328._24_4_ * fVar176;
      auVar52._28_4_ = uVar3;
      auVar85 = vsubps_avx(auVar51,auVar52);
      auVar53._4_4_ = auVar253._4_4_ * fVar200;
      auVar53._0_4_ = auVar253._0_4_ * fVar199;
      auVar53._8_4_ = auVar253._8_4_ * fVar201;
      auVar53._12_4_ = auVar253._12_4_ * fVar202;
      auVar53._16_4_ = auVar253._16_4_ * fVar203;
      auVar53._20_4_ = auVar253._20_4_ * fVar204;
      auVar53._24_4_ = auVar253._24_4_ * fVar131;
      auVar53._28_4_ = auVar253._28_4_;
      auVar54._4_4_ = auVar235._4_4_ * fVar156;
      auVar54._0_4_ = auVar235._0_4_ * fVar155;
      auVar54._8_4_ = auVar235._8_4_ * fVar157;
      auVar54._12_4_ = auVar235._12_4_ * fVar158;
      auVar54._16_4_ = auVar235._16_4_ * fVar161;
      auVar54._20_4_ = auVar235._20_4_ * fVar174;
      auVar54._24_4_ = auVar235._24_4_ * fVar176;
      auVar54._28_4_ = auVar235._28_4_;
      auVar86 = vsubps_avx(auVar53,auVar54);
      auVar55._4_4_ = fVar200 * fStack_114;
      auVar55._0_4_ = fVar199 * local_118;
      auVar55._8_4_ = fVar201 * fStack_110;
      auVar55._12_4_ = fVar202 * fStack_10c;
      auVar55._16_4_ = fVar203 * fStack_108;
      auVar55._20_4_ = fVar204 * fStack_104;
      auVar55._24_4_ = fVar131 * fStack_100;
      auVar55._28_4_ = auVar253._28_4_;
      auVar56._4_4_ = fVar156 * fStack_f4;
      auVar56._0_4_ = fVar155 * local_f8;
      auVar56._8_4_ = fVar157 * fStack_f0;
      auVar56._12_4_ = fVar158 * fStack_ec;
      auVar56._16_4_ = fVar161 * fStack_e8;
      auVar56._20_4_ = fVar174 * fStack_e4;
      auVar56._24_4_ = fVar176 * fStack_e0;
      auVar56._28_4_ = uVar3;
      auVar87 = vsubps_avx(auVar55,auVar56);
      auVar57._4_4_ = fVar200 * auVar20._4_4_;
      auVar57._0_4_ = fVar199 * auVar20._0_4_;
      auVar57._8_4_ = fVar201 * auVar20._8_4_;
      auVar57._12_4_ = fVar202 * auVar20._12_4_;
      auVar57._16_4_ = fVar203 * auVar20._16_4_;
      auVar57._20_4_ = fVar204 * auVar20._20_4_;
      auVar57._24_4_ = fVar131 * auVar20._24_4_;
      auVar57._28_4_ = uVar3;
      auVar58._4_4_ = fVar156 * auVar19._4_4_;
      auVar58._0_4_ = fVar155 * auVar19._0_4_;
      auVar58._8_4_ = fVar157 * auVar19._8_4_;
      auVar58._12_4_ = fVar158 * auVar19._12_4_;
      auVar58._16_4_ = fVar161 * auVar19._16_4_;
      auVar58._20_4_ = fVar174 * auVar19._20_4_;
      auVar58._24_4_ = fVar176 * auVar19._24_4_;
      auVar58._28_4_ = local_b8._28_4_;
      auVar19 = vsubps_avx(auVar57,auVar58);
      auVar59._4_4_ = auVar21._4_4_ * fVar200;
      auVar59._0_4_ = auVar21._0_4_ * fVar199;
      auVar59._8_4_ = auVar21._8_4_ * fVar201;
      auVar59._12_4_ = auVar21._12_4_ * fVar202;
      auVar59._16_4_ = auVar21._16_4_ * fVar203;
      auVar59._20_4_ = auVar21._20_4_ * fVar204;
      auVar59._24_4_ = auVar21._24_4_ * fVar131;
      auVar59._28_4_ = auVar14._28_4_ + auVar15._28_4_;
      auVar60._4_4_ = auVar18._4_4_ * fVar156;
      auVar60._0_4_ = auVar18._0_4_ * fVar155;
      auVar60._8_4_ = auVar18._8_4_ * fVar157;
      auVar60._12_4_ = auVar18._12_4_ * fVar158;
      auVar60._16_4_ = auVar18._16_4_ * fVar161;
      auVar60._20_4_ = auVar18._20_4_ * fVar174;
      auVar60._24_4_ = auVar18._24_4_ * fVar176;
      auVar60._28_4_ = auVar16._28_4_ + fVar182;
      auVar21 = vsubps_avx(auVar59,auVar60);
      auVar15 = vminps_avx(auVar17,auVar23);
      auVar14 = vmaxps_avx(auVar17,auVar23);
      auVar16 = vminps_avx(auVar24,auVar85);
      auVar16 = vminps_avx(auVar15,auVar16);
      auVar15 = vmaxps_avx(auVar24,auVar85);
      auVar14 = vmaxps_avx(auVar14,auVar15);
      auVar17 = vminps_avx(auVar86,auVar87);
      auVar15 = vmaxps_avx(auVar86,auVar87);
      auVar18 = vminps_avx(auVar19,auVar21);
      auVar17 = vminps_avx(auVar17,auVar18);
      auVar17 = vminps_avx(auVar16,auVar17);
      auVar16 = vmaxps_avx(auVar19,auVar21);
      auVar15 = vmaxps_avx(auVar15,auVar16);
      auVar15 = vmaxps_avx(auVar14,auVar15);
      auVar14 = vcmpps_avx(auVar17,local_138,2);
      auVar15 = vcmpps_avx(auVar15,local_158,5);
      auVar14 = vandps_avx(auVar15,auVar14);
      auVar84 = vandps_avx(auVar84,local_1b8);
      auVar15 = auVar84 & auVar14;
      if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar15 >> 0x7f,0) != '\0') ||
            (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar15 >> 0xbf,0) != '\0') ||
          (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar15[0x1f] < '\0') {
        auVar84 = vandps_avx(auVar14,auVar84);
        uVar69 = vmovmskps_avx(auVar84);
      }
    }
    if (uVar69 != 0) {
      auStack_278[uVar73] = uVar69;
      uVar4 = vmovlps_avx(local_1f8);
      *(undefined8 *)(afStack_198 + uVar73 * 2) = uVar4;
      uVar5 = vmovlps_avx(local_488);
      auStack_58[uVar73] = uVar5;
      uVar73 = (ulong)((int)uVar73 + 1);
    }
    auVar325 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,&DAT_3f8000003f800000)));
    _local_3d8 = auVar20;
    do {
      if ((int)uVar73 == 0) {
        if ((uVar74 & 1) != 0) {
          return local_4d9;
        }
        fVar182 = ray->tfar;
        auVar92._4_4_ = fVar182;
        auVar92._0_4_ = fVar182;
        auVar92._8_4_ = fVar182;
        auVar92._12_4_ = fVar182;
        auVar92._16_4_ = fVar182;
        auVar92._20_4_ = fVar182;
        auVar92._24_4_ = fVar182;
        auVar92._28_4_ = fVar182;
        auVar84 = vcmpps_avx(local_178,auVar92,2);
        uVar69 = vmovmskps_avx(auVar84);
        uVar69 = (uint)uVar75 & uVar69;
        local_4d9 = uVar69 != 0;
        if (!local_4d9) {
          return local_4d9;
        }
        goto LAB_01169ba8;
      }
      uVar70 = (int)uVar73 - 1;
      uVar71 = (ulong)uVar70;
      uVar69 = auStack_278[uVar71];
      fVar182 = afStack_198[uVar71 * 2];
      fVar199 = afStack_198[uVar71 * 2 + 1];
      local_488._8_8_ = 0;
      local_488._0_8_ = auStack_58[uVar71];
      uVar5 = 0;
      if (uVar69 != 0) {
        for (; (uVar69 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
        }
      }
      uVar69 = uVar69 - 1 & uVar69;
      auStack_278[uVar71] = uVar69;
      if (uVar69 == 0) {
        uVar73 = (ulong)uVar70;
      }
      fVar201 = (float)(uVar5 + 1) * 0.14285715;
      fVar200 = (1.0 - (float)uVar5 * 0.14285715) * fVar182 + fVar199 * (float)uVar5 * 0.14285715;
      fVar182 = (1.0 - fVar201) * fVar182 + fVar199 * fVar201;
      fVar199 = fVar182 - fVar200;
      _local_448 = ZEXT432((uint)fVar200);
      auVar240 = ZEXT416((uint)fVar200);
      _local_428 = ZEXT416((uint)fVar182);
      auVar101 = ZEXT416((uint)fVar200);
      if (0.16666667 <= fVar199) break;
      auVar101 = vshufps_avx(local_488,local_488,0x50);
      auVar22 = vsubps_avx(auVar325._0_16_,auVar101);
      fVar201 = auVar101._0_4_;
      fVar202 = auVar101._4_4_;
      fVar203 = auVar101._8_4_;
      fVar204 = auVar101._12_4_;
      fVar131 = auVar22._0_4_;
      fVar155 = auVar22._4_4_;
      fVar156 = auVar22._8_4_;
      fVar157 = auVar22._12_4_;
      auVar137._0_4_ = auVar267._0_4_ * fVar201 + fVar131 * fVar159;
      auVar137._4_4_ = auVar267._4_4_ * fVar202 + fVar155 * fVar160;
      auVar137._8_4_ = auVar267._0_4_ * fVar203 + fVar156 * fVar159;
      auVar137._12_4_ = auVar267._4_4_ * fVar204 + fVar157 * fVar160;
      auVar163._0_4_ = (float)local_338._0_4_ * fVar201 + auVar95._0_4_ * fVar131;
      auVar163._4_4_ = (float)local_338._4_4_ * fVar202 + auVar95._4_4_ * fVar155;
      auVar163._8_4_ = fStack_330 * fVar203 + auVar95._0_4_ * fVar156;
      auVar163._12_4_ = fStack_32c * fVar204 + auVar95._4_4_ * fVar157;
      auVar189._0_4_ = (float)local_348._0_4_ * fVar201 + auVar318._0_4_ * fVar131;
      auVar189._4_4_ = (float)local_348._4_4_ * fVar202 + auVar318._4_4_ * fVar155;
      auVar189._8_4_ = fStack_340 * fVar203 + auVar318._0_4_ * fVar156;
      auVar189._12_4_ = fStack_33c * fVar204 + auVar318._4_4_ * fVar157;
      auVar97._0_4_ = (float)local_358._0_4_ * fVar201 + fVar131 * auVar256._0_4_;
      auVar97._4_4_ = (float)local_358._4_4_ * fVar202 + fVar155 * auVar256._4_4_;
      auVar97._8_4_ = fStack_350 * fVar203 + fVar156 * auVar256._0_4_;
      auVar97._12_4_ = fStack_34c * fVar204 + fVar157 * auVar256._4_4_;
      auVar128._16_16_ = auVar137;
      auVar128._0_16_ = auVar137;
      auVar152._16_16_ = auVar163;
      auVar152._0_16_ = auVar163;
      auVar173._16_16_ = auVar189;
      auVar173._0_16_ = auVar189;
      auVar84 = vshufps_avx(ZEXT2032(CONCAT416(fVar182,ZEXT416((uint)fVar200))),
                            ZEXT2032(CONCAT416(fVar182,ZEXT416((uint)fVar200))),0);
      auVar14 = vsubps_avx(auVar152,auVar128);
      fVar201 = auVar84._0_4_;
      fVar202 = auVar84._4_4_;
      fVar203 = auVar84._8_4_;
      fVar204 = auVar84._12_4_;
      fVar131 = auVar84._16_4_;
      fVar155 = auVar84._20_4_;
      fVar156 = auVar84._24_4_;
      auVar129._0_4_ = auVar137._0_4_ + auVar14._0_4_ * fVar201;
      auVar129._4_4_ = auVar137._4_4_ + auVar14._4_4_ * fVar202;
      auVar129._8_4_ = auVar137._8_4_ + auVar14._8_4_ * fVar203;
      auVar129._12_4_ = auVar137._12_4_ + auVar14._12_4_ * fVar204;
      auVar129._16_4_ = auVar137._0_4_ + auVar14._16_4_ * fVar131;
      auVar129._20_4_ = auVar137._4_4_ + auVar14._20_4_ * fVar155;
      auVar129._24_4_ = auVar137._8_4_ + auVar14._24_4_ * fVar156;
      auVar129._28_4_ = auVar137._12_4_ + auVar14._28_4_;
      auVar14 = vsubps_avx(auVar173,auVar152);
      auVar153._0_4_ = auVar163._0_4_ + auVar14._0_4_ * fVar201;
      auVar153._4_4_ = auVar163._4_4_ + auVar14._4_4_ * fVar202;
      auVar153._8_4_ = auVar163._8_4_ + auVar14._8_4_ * fVar203;
      auVar153._12_4_ = auVar163._12_4_ + auVar14._12_4_ * fVar204;
      auVar153._16_4_ = auVar163._0_4_ + auVar14._16_4_ * fVar131;
      auVar153._20_4_ = auVar163._4_4_ + auVar14._20_4_ * fVar155;
      auVar153._24_4_ = auVar163._8_4_ + auVar14._24_4_ * fVar156;
      auVar153._28_4_ = auVar163._12_4_ + auVar14._28_4_;
      auVar101 = vsubps_avx(auVar97,auVar189);
      auVar113._0_4_ = auVar189._0_4_ + auVar101._0_4_ * fVar201;
      auVar113._4_4_ = auVar189._4_4_ + auVar101._4_4_ * fVar202;
      auVar113._8_4_ = auVar189._8_4_ + auVar101._8_4_ * fVar203;
      auVar113._12_4_ = auVar189._12_4_ + auVar101._12_4_ * fVar204;
      auVar113._16_4_ = auVar189._0_4_ + auVar101._0_4_ * fVar131;
      auVar113._20_4_ = auVar189._4_4_ + auVar101._4_4_ * fVar155;
      auVar113._24_4_ = auVar189._8_4_ + auVar101._8_4_ * fVar156;
      auVar113._28_4_ = auVar189._12_4_ + auVar101._12_4_;
      auVar14 = vsubps_avx(auVar153,auVar129);
      auVar130._0_4_ = auVar129._0_4_ + fVar201 * auVar14._0_4_;
      auVar130._4_4_ = auVar129._4_4_ + fVar202 * auVar14._4_4_;
      auVar130._8_4_ = auVar129._8_4_ + fVar203 * auVar14._8_4_;
      auVar130._12_4_ = auVar129._12_4_ + fVar204 * auVar14._12_4_;
      auVar130._16_4_ = auVar129._16_4_ + fVar131 * auVar14._16_4_;
      auVar130._20_4_ = auVar129._20_4_ + fVar155 * auVar14._20_4_;
      auVar130._24_4_ = auVar129._24_4_ + fVar156 * auVar14._24_4_;
      auVar130._28_4_ = auVar129._28_4_ + auVar14._28_4_;
      auVar14 = vsubps_avx(auVar113,auVar153);
      auVar114._0_4_ = auVar153._0_4_ + fVar201 * auVar14._0_4_;
      auVar114._4_4_ = auVar153._4_4_ + fVar202 * auVar14._4_4_;
      auVar114._8_4_ = auVar153._8_4_ + fVar203 * auVar14._8_4_;
      auVar114._12_4_ = auVar153._12_4_ + fVar204 * auVar14._12_4_;
      auVar114._16_4_ = auVar153._16_4_ + fVar131 * auVar14._16_4_;
      auVar114._20_4_ = auVar153._20_4_ + fVar155 * auVar14._20_4_;
      auVar114._24_4_ = auVar153._24_4_ + fVar156 * auVar14._24_4_;
      auVar114._28_4_ = auVar153._28_4_ + auVar14._28_4_;
      auVar14 = vsubps_avx(auVar114,auVar130);
      auVar138._0_4_ = auVar130._0_4_ + fVar201 * auVar14._0_4_;
      auVar138._4_4_ = auVar130._4_4_ + fVar202 * auVar14._4_4_;
      auVar138._8_4_ = auVar130._8_4_ + fVar203 * auVar14._8_4_;
      auVar138._12_4_ = auVar130._12_4_ + fVar204 * auVar14._12_4_;
      auVar154._16_4_ = auVar130._16_4_ + fVar131 * auVar14._16_4_;
      auVar154._0_16_ = auVar138;
      auVar154._20_4_ = auVar130._20_4_ + fVar155 * auVar14._20_4_;
      auVar154._24_4_ = auVar130._24_4_ + fVar156 * auVar14._24_4_;
      auVar154._28_4_ = auVar130._28_4_ + auVar153._28_4_;
      fVar201 = auVar14._4_4_ * 3.0;
      auVar118 = auVar154._16_16_;
      auVar100 = vshufps_avx(ZEXT416((uint)(fVar199 * 0.33333334)),
                             ZEXT416((uint)(fVar199 * 0.33333334)),0);
      auVar257._0_4_ = auVar138._0_4_ + auVar100._0_4_ * auVar14._0_4_ * 3.0;
      auVar257._4_4_ = auVar138._4_4_ + auVar100._4_4_ * fVar201;
      auVar257._8_4_ = auVar138._8_4_ + auVar100._8_4_ * auVar14._8_4_ * 3.0;
      auVar257._12_4_ = auVar138._12_4_ + auVar100._12_4_ * auVar14._12_4_ * 3.0;
      auVar196 = vshufpd_avx(auVar138,auVar138,3);
      auVar143 = vshufpd_avx(auVar118,auVar118,3);
      _local_328 = auVar196;
      auVar15 = _local_328;
      auVar101 = vsubps_avx(auVar196,auVar138);
      _local_468 = auVar143;
      auVar22 = vsubps_avx(auVar143,auVar118);
      auVar98._0_4_ = auVar101._0_4_ + auVar22._0_4_;
      auVar98._4_4_ = auVar101._4_4_ + auVar22._4_4_;
      auVar98._8_4_ = auVar101._8_4_ + auVar22._8_4_;
      auVar98._12_4_ = auVar101._12_4_ + auVar22._12_4_;
      auVar101 = vmovshdup_avx(auVar138);
      auVar22 = vmovshdup_avx(auVar257);
      auVar142 = vshufps_avx(auVar98,auVar98,0);
      auVar82 = vshufps_avx(auVar98,auVar98,0x55);
      fVar155 = auVar82._0_4_;
      fVar156 = auVar82._4_4_;
      fVar157 = auVar82._8_4_;
      fVar158 = auVar82._12_4_;
      fVar202 = auVar142._0_4_;
      fVar203 = auVar142._4_4_;
      fVar204 = auVar142._8_4_;
      fVar131 = auVar142._12_4_;
      auVar243._0_4_ = fVar202 * auVar138._0_4_ + fVar155 * auVar101._0_4_;
      auVar243._4_4_ = fVar203 * auVar138._4_4_ + fVar156 * auVar101._4_4_;
      auVar243._8_4_ = fVar204 * auVar138._8_4_ + fVar157 * auVar101._8_4_;
      auVar243._12_4_ = fVar131 * auVar138._12_4_ + fVar158 * auVar101._12_4_;
      _local_3d8 = auVar257;
      auVar258._0_4_ = auVar257._0_4_ * fVar202 + fVar155 * auVar22._0_4_;
      auVar258._4_4_ = auVar257._4_4_ * fVar203 + fVar156 * auVar22._4_4_;
      auVar258._8_4_ = auVar257._8_4_ * fVar204 + fVar157 * auVar22._8_4_;
      auVar258._12_4_ = auVar257._12_4_ * fVar131 + fVar158 * auVar22._12_4_;
      auVar22 = vshufps_avx(auVar243,auVar243,0xe8);
      auVar142 = vshufps_avx(auVar258,auVar258,0xe8);
      auVar101 = vcmpps_avx(auVar22,auVar142,1);
      uVar69 = vextractps_avx(auVar101,0);
      auVar82 = auVar258;
      if ((uVar69 & 1) == 0) {
        auVar82 = auVar243;
      }
      auVar99._0_4_ = auVar100._0_4_ * auVar14._16_4_ * 3.0;
      auVar99._4_4_ = auVar100._4_4_ * fVar201;
      auVar99._8_4_ = auVar100._8_4_ * auVar14._24_4_ * 3.0;
      auVar99._12_4_ = auVar100._12_4_ * auVar84._28_4_;
      auVar7 = vsubps_avx(auVar118,auVar99);
      auVar100 = vmovshdup_avx(auVar7);
      auVar118 = vmovshdup_avx(auVar118);
      fVar201 = auVar7._0_4_;
      fVar161 = auVar7._4_4_;
      auVar320._0_4_ = fVar202 * fVar201 + fVar155 * auVar100._0_4_;
      auVar320._4_4_ = fVar203 * fVar161 + fVar156 * auVar100._4_4_;
      auVar320._8_4_ = fVar204 * auVar7._8_4_ + fVar157 * auVar100._8_4_;
      auVar320._12_4_ = fVar131 * auVar7._12_4_ + fVar158 * auVar100._12_4_;
      auVar303._0_4_ = fVar202 * auVar154._16_4_ + fVar155 * auVar118._0_4_;
      auVar303._4_4_ = fVar203 * auVar154._20_4_ + fVar156 * auVar118._4_4_;
      auVar303._8_4_ = fVar204 * auVar154._24_4_ + fVar157 * auVar118._8_4_;
      auVar303._12_4_ = fVar131 * auVar154._28_4_ + fVar158 * auVar118._12_4_;
      auVar118 = vshufps_avx(auVar320,auVar320,0xe8);
      auVar241 = vshufps_avx(auVar303,auVar303,0xe8);
      auVar100 = vcmpps_avx(auVar118,auVar241,1);
      uVar69 = vextractps_avx(auVar100,0);
      auVar227 = auVar303;
      if ((uVar69 & 1) == 0) {
        auVar227 = auVar320;
      }
      auVar82 = vmaxss_avx(auVar227,auVar82);
      auVar22 = vminps_avx(auVar22,auVar142);
      auVar142 = vminps_avx(auVar118,auVar241);
      auVar142 = vminps_avx(auVar22,auVar142);
      auVar101 = vshufps_avx(auVar101,auVar101,0x55);
      auVar101 = vblendps_avx(auVar101,auVar100,2);
      auVar100 = vpslld_avx(auVar101,0x1f);
      auVar101 = vshufpd_avx(auVar258,auVar258,1);
      auVar101 = vinsertps_avx(auVar101,auVar303,0x9c);
      auVar22 = vshufpd_avx(auVar243,auVar243,1);
      auVar22 = vinsertps_avx(auVar22,auVar320,0x9c);
      auVar101 = vblendvps_avx(auVar22,auVar101,auVar100);
      auVar22 = vmovshdup_avx(auVar101);
      auVar101 = vmaxss_avx(auVar22,auVar101);
      fVar204 = auVar142._0_4_;
      auVar22 = vmovshdup_avx(auVar142);
      fVar203 = auVar101._0_4_;
      fVar131 = auVar22._0_4_;
      fVar202 = auVar82._0_4_;
      _local_328 = auVar15;
      if ((0.0001 <= fVar204) || (fVar203 <= -0.0001)) {
        if ((-0.0001 < fVar202 && fVar131 < 0.0001) ||
           ((fVar204 < 0.0001 && -0.0001 < fVar202 || (fVar131 < 0.0001 && -0.0001 < fVar203))))
        goto LAB_0116add2;
LAB_0116b9f4:
        bVar61 = true;
        auVar325 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,&DAT_3f8000003f800000)));
      }
      else {
LAB_0116add2:
        auVar100 = vcmpps_avx(auVar142,ZEXT816(0) << 0x20,1);
        auVar22 = vcmpss_avx(auVar82,ZEXT416(0),1);
        auVar321._8_4_ = 0x3f800000;
        auVar321._0_8_ = &DAT_3f8000003f800000;
        auVar321._12_4_ = 0x3f800000;
        auVar325 = ZEXT1664(auVar321);
        auVar190._8_4_ = 0xbf800000;
        auVar190._0_8_ = 0xbf800000bf800000;
        auVar190._12_4_ = 0xbf800000;
        auVar22 = vblendvps_avx(auVar321,auVar190,auVar22);
        auVar100 = vblendvps_avx(auVar321,auVar190,auVar100);
        auVar118 = vcmpss_avx(auVar22,auVar100,4);
        auVar118 = vpshufd_avx(ZEXT416(auVar118._0_4_ & 1),0x50);
        auVar118 = vpslld_avx(auVar118,0x1f);
        auVar118 = vpsrad_avx(auVar118,0x1f);
        auVar118 = vpandn_avx(auVar118,_DAT_02020eb0);
        auVar241 = vmovshdup_avx(auVar100);
        fVar155 = auVar241._0_4_;
        if ((auVar100._0_4_ != fVar155) || (NAN(auVar100._0_4_) || NAN(fVar155))) {
          if ((fVar131 != fVar204) || (NAN(fVar131) || NAN(fVar204))) {
            fVar204 = -fVar204 / (fVar131 - fVar204);
            auVar100 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar204) * 0.0 + fVar204)));
          }
          else {
            auVar100 = vcmpss_avx(auVar142,ZEXT416(0),0);
            auVar100 = vpshufd_avx(ZEXT416(auVar100._0_4_ & 1),0x50);
            auVar100 = vpslld_avx(auVar100,0x1f);
            auVar100 = vblendvps_avx(ZEXT816(0xff8000007f800000),_DAT_01fec6f0,auVar100);
          }
          auVar241 = vcmpps_avx(auVar118,auVar100,1);
          auVar142 = vblendps_avx(auVar118,auVar100,2);
          auVar100 = vblendps_avx(auVar100,auVar118,2);
          auVar118 = vblendvps_avx(auVar100,auVar142,auVar241);
        }
        auVar101 = vcmpss_avx(auVar101,ZEXT416(0),1);
        auVar119._8_4_ = 0xbf800000;
        auVar119._0_8_ = 0xbf800000bf800000;
        auVar119._12_4_ = 0xbf800000;
        auVar101 = vblendvps_avx(auVar321,auVar119,auVar101);
        fVar204 = auVar101._0_4_;
        if ((auVar22._0_4_ != fVar204) || (NAN(auVar22._0_4_) || NAN(fVar204))) {
          if ((fVar203 != fVar202) || (NAN(fVar203) || NAN(fVar202))) {
            fVar202 = -fVar202 / (fVar203 - fVar202);
            auVar101 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar202) * 0.0 + fVar202)));
          }
          else {
            auVar101 = vcmpss_avx(auVar82,ZEXT416(0),0);
            auVar101 = vpshufd_avx(ZEXT416(auVar101._0_4_ & 1),0x50);
            auVar101 = vpslld_avx(auVar101,0x1f);
            auVar101 = vblendvps_avx(ZEXT816(0xff8000007f800000),_DAT_01fec6f0,auVar101);
          }
          auVar100 = vcmpps_avx(auVar118,auVar101,1);
          auVar22 = vblendps_avx(auVar118,auVar101,2);
          auVar101 = vblendps_avx(auVar101,auVar118,2);
          auVar118 = vblendvps_avx(auVar101,auVar22,auVar100);
        }
        if ((fVar155 != fVar204) || (NAN(fVar155) || NAN(fVar204))) {
          auVar101 = vcmpps_avx(auVar118,auVar321,1);
          auVar22 = vinsertps_avx(auVar118,SUB6416(ZEXT464(0x3f800000),0),0x10);
          auVar191._4_12_ = auVar118._4_12_;
          auVar191._0_4_ = 0x3f800000;
          auVar118 = vblendvps_avx(auVar191,auVar22,auVar101);
        }
        auVar101 = vcmpps_avx(auVar118,_DAT_01fec6f0,1);
        auVar62._12_4_ = 0;
        auVar62._0_12_ = auVar118._4_12_;
        auVar22 = vinsertps_avx(auVar118,ZEXT416(0x3f800000),0x10);
        auVar101 = vblendvps_avx(auVar22,auVar62 << 0x20,auVar101);
        auVar22 = vmovshdup_avx(auVar101);
        bVar61 = true;
        if (auVar101._0_4_ <= auVar22._0_4_) {
          auVar102._0_4_ = auVar101._0_4_ + -0.1;
          auVar102._4_4_ = auVar101._4_4_ + 0.1;
          auVar102._8_4_ = auVar101._8_4_ + 0.0;
          auVar102._12_4_ = auVar101._12_4_ + 0.0;
          auVar100 = vshufpd_avx(auVar257,auVar257,3);
          register0x000012c8 = 0x3f80000000000000;
          local_3d8 = 0x3f80000000000000;
          auVar101 = vcmpps_avx(auVar102,_local_3d8,1);
          auVar63._12_4_ = 0;
          auVar63._0_12_ = auVar102._4_12_;
          auVar22 = vinsertps_avx(auVar102,SUB6416(ZEXT464(0x3f800000),0),0x10);
          auVar101 = vblendvps_avx(auVar22,auVar63 << 0x20,auVar101);
          auVar22 = vshufpd_avx(auVar7,auVar7,3);
          auVar142 = vshufps_avx(auVar101,auVar101,0x50);
          auVar82 = vsubps_avx(auVar321,auVar142);
          local_328._0_4_ = auVar196._0_4_;
          local_328._4_4_ = auVar196._4_4_;
          fStack_320 = auVar196._8_4_;
          fStack_31c = auVar196._12_4_;
          fVar202 = auVar142._0_4_;
          fVar203 = auVar142._4_4_;
          fVar204 = auVar142._8_4_;
          fVar131 = auVar142._12_4_;
          local_468._0_4_ = auVar143._0_4_;
          local_468._4_4_ = auVar143._4_4_;
          fStack_460 = auVar143._8_4_;
          fStack_45c = auVar143._12_4_;
          fVar155 = auVar82._0_4_;
          fVar156 = auVar82._4_4_;
          fVar157 = auVar82._8_4_;
          fVar158 = auVar82._12_4_;
          auVar120._0_4_ = fVar202 * (float)local_328._0_4_ + fVar155 * auVar138._0_4_;
          auVar120._4_4_ = fVar203 * (float)local_328._4_4_ + fVar156 * auVar138._4_4_;
          auVar120._8_4_ = fVar204 * fStack_320 + fVar157 * auVar138._0_4_;
          auVar120._12_4_ = fVar131 * fStack_31c + fVar158 * auVar138._4_4_;
          auVar164._0_4_ = fVar202 * auVar100._0_4_ + fVar155 * auVar257._0_4_;
          auVar164._4_4_ = fVar203 * auVar100._4_4_ + fVar156 * auVar257._4_4_;
          auVar164._8_4_ = fVar204 * auVar100._8_4_ + fVar157 * auVar257._0_4_;
          auVar164._12_4_ = fVar131 * auVar100._12_4_ + fVar158 * auVar257._4_4_;
          auVar228._0_4_ = fVar202 * auVar22._0_4_ + fVar155 * fVar201;
          auVar228._4_4_ = fVar203 * auVar22._4_4_ + fVar156 * fVar161;
          auVar228._8_4_ = fVar204 * auVar22._8_4_ + fVar157 * fVar201;
          auVar228._12_4_ = fVar131 * auVar22._12_4_ + fVar158 * fVar161;
          auVar244._0_4_ = fVar202 * (float)local_468._0_4_ + fVar155 * auVar154._16_4_;
          auVar244._4_4_ = fVar203 * (float)local_468._4_4_ + fVar156 * auVar154._20_4_;
          auVar244._8_4_ = fVar204 * fStack_460 + fVar157 * auVar154._16_4_;
          auVar244._12_4_ = fVar131 * fStack_45c + fVar158 * auVar154._20_4_;
          auVar143 = vsubps_avx(auVar321,auVar101);
          auVar22 = vmovshdup_avx(local_488);
          auVar196 = vmovsldup_avx(local_488);
          local_488._0_4_ = auVar143._0_4_ * auVar196._0_4_ + auVar22._0_4_ * auVar101._0_4_;
          local_488._4_4_ = auVar143._4_4_ * auVar196._4_4_ + auVar22._4_4_ * auVar101._4_4_;
          local_488._8_4_ = auVar143._8_4_ * auVar196._8_4_ + auVar22._8_4_ * auVar101._8_4_;
          local_488._12_4_ = auVar143._12_4_ * auVar196._12_4_ + auVar22._12_4_ * auVar101._12_4_;
          _local_468 = vmovshdup_avx(local_488);
          auVar101 = vsubps_avx(auVar164,auVar120);
          auVar192._0_4_ = auVar101._0_4_ * 3.0;
          auVar192._4_4_ = auVar101._4_4_ * 3.0;
          auVar192._8_4_ = auVar101._8_4_ * 3.0;
          auVar192._12_4_ = auVar101._12_4_ * 3.0;
          auVar101 = vsubps_avx(auVar228,auVar164);
          auVar211._0_4_ = auVar101._0_4_ * 3.0;
          auVar211._4_4_ = auVar101._4_4_ * 3.0;
          auVar211._8_4_ = auVar101._8_4_ * 3.0;
          auVar211._12_4_ = auVar101._12_4_ * 3.0;
          auVar101 = vsubps_avx(auVar244,auVar228);
          auVar259._0_4_ = auVar101._0_4_ * 3.0;
          auVar259._4_4_ = auVar101._4_4_ * 3.0;
          auVar259._8_4_ = auVar101._8_4_ * 3.0;
          auVar259._12_4_ = auVar101._12_4_ * 3.0;
          auVar22 = vminps_avx(auVar211,auVar259);
          auVar101 = vmaxps_avx(auVar211,auVar259);
          auVar22 = vminps_avx(auVar192,auVar22);
          auVar101 = vmaxps_avx(auVar192,auVar101);
          auVar196 = vshufpd_avx(auVar22,auVar22,3);
          auVar143 = vshufpd_avx(auVar101,auVar101,3);
          auVar22 = vminps_avx(auVar22,auVar196);
          auVar101 = vmaxps_avx(auVar101,auVar143);
          auVar196 = vshufps_avx(ZEXT416((uint)(1.0 / fVar199)),ZEXT416((uint)(1.0 / fVar199)),0);
          auVar193._0_4_ = auVar196._0_4_ * auVar22._0_4_;
          auVar193._4_4_ = auVar196._4_4_ * auVar22._4_4_;
          auVar193._8_4_ = auVar196._8_4_ * auVar22._8_4_;
          auVar193._12_4_ = auVar196._12_4_ * auVar22._12_4_;
          auVar212._0_4_ = auVar101._0_4_ * auVar196._0_4_;
          auVar212._4_4_ = auVar101._4_4_ * auVar196._4_4_;
          auVar212._8_4_ = auVar101._8_4_ * auVar196._8_4_;
          auVar212._12_4_ = auVar101._12_4_ * auVar196._12_4_;
          auVar82 = ZEXT416((uint)(1.0 / (local_468._0_4_ - local_488._0_4_)));
          auVar101 = vshufpd_avx(auVar120,auVar120,3);
          auVar22 = vshufpd_avx(auVar164,auVar164,3);
          auVar196 = vshufpd_avx(auVar228,auVar228,3);
          auVar143 = vshufpd_avx(auVar244,auVar244,3);
          auVar101 = vsubps_avx(auVar101,auVar120);
          auVar100 = vsubps_avx(auVar22,auVar164);
          auVar142 = vsubps_avx(auVar196,auVar228);
          auVar143 = vsubps_avx(auVar143,auVar244);
          auVar22 = vminps_avx(auVar101,auVar100);
          auVar101 = vmaxps_avx(auVar101,auVar100);
          auVar196 = vminps_avx(auVar142,auVar143);
          auVar196 = vminps_avx(auVar22,auVar196);
          auVar22 = vmaxps_avx(auVar142,auVar143);
          auVar101 = vmaxps_avx(auVar101,auVar22);
          auVar22 = vshufps_avx(auVar82,auVar82,0);
          auVar268._0_4_ = auVar22._0_4_ * auVar196._0_4_;
          auVar268._4_4_ = auVar22._4_4_ * auVar196._4_4_;
          auVar268._8_4_ = auVar22._8_4_ * auVar196._8_4_;
          auVar268._12_4_ = auVar22._12_4_ * auVar196._12_4_;
          auVar277._0_4_ = auVar22._0_4_ * auVar101._0_4_;
          auVar277._4_4_ = auVar22._4_4_ * auVar101._4_4_;
          auVar277._8_4_ = auVar22._8_4_ * auVar101._8_4_;
          auVar277._12_4_ = auVar22._12_4_ * auVar101._12_4_;
          auVar101 = vmovsldup_avx(local_488);
          auVar229._4_12_ = auVar101._4_12_;
          auVar229._0_4_ = fVar200;
          auVar245._4_12_ = local_488._4_12_;
          auVar245._0_4_ = fVar182;
          auVar83._0_4_ = (fVar182 + fVar200) * 0.5;
          auVar83._4_4_ = (local_488._4_4_ + auVar101._4_4_) * 0.5;
          auVar83._8_4_ = (local_488._8_4_ + auVar101._8_4_) * 0.5;
          auVar83._12_4_ = (local_488._12_4_ + auVar101._12_4_) * 0.5;
          auVar101 = vshufps_avx(auVar83,auVar83,0);
          fVar201 = auVar101._0_4_;
          fVar202 = auVar101._4_4_;
          fVar203 = auVar101._8_4_;
          fVar204 = auVar101._12_4_;
          auVar165._0_4_ = fVar201 * (float)local_1c8._0_4_ + (float)local_2e8._0_4_;
          auVar165._4_4_ = fVar202 * (float)local_1c8._4_4_ + (float)local_2e8._4_4_;
          auVar165._8_4_ = fVar203 * fStack_1c0 + fStack_2e0;
          auVar165._12_4_ = fVar204 * fStack_1bc + fStack_2dc;
          auVar260._0_4_ = fVar201 * (float)local_1d8._0_4_ + (float)local_2f8._0_4_;
          auVar260._4_4_ = fVar202 * (float)local_1d8._4_4_ + (float)local_2f8._4_4_;
          auVar260._8_4_ = fVar203 * fStack_1d0 + fStack_2f0;
          auVar260._12_4_ = fVar204 * fStack_1cc + fStack_2ec;
          auVar291._0_4_ = fVar201 * (float)local_1e8._0_4_ + (float)local_308._0_4_;
          auVar291._4_4_ = fVar202 * (float)local_1e8._4_4_ + (float)local_308._4_4_;
          auVar291._8_4_ = fVar203 * fStack_1e0 + fStack_300;
          auVar291._12_4_ = fVar204 * fStack_1dc + fStack_2fc;
          auVar101 = vsubps_avx(auVar260,auVar165);
          auVar166._0_4_ = auVar101._0_4_ * fVar201 + auVar165._0_4_;
          auVar166._4_4_ = auVar101._4_4_ * fVar202 + auVar165._4_4_;
          auVar166._8_4_ = auVar101._8_4_ * fVar203 + auVar165._8_4_;
          auVar166._12_4_ = auVar101._12_4_ * fVar204 + auVar165._12_4_;
          auVar101 = vsubps_avx(auVar291,auVar260);
          auVar261._0_4_ = auVar260._0_4_ + auVar101._0_4_ * fVar201;
          auVar261._4_4_ = auVar260._4_4_ + auVar101._4_4_ * fVar202;
          auVar261._8_4_ = auVar260._8_4_ + auVar101._8_4_ * fVar203;
          auVar261._12_4_ = auVar260._12_4_ + auVar101._12_4_ * fVar204;
          auVar101 = vsubps_avx(auVar261,auVar166);
          fVar201 = auVar166._0_4_ + auVar101._0_4_ * fVar201;
          fVar202 = auVar166._4_4_ + auVar101._4_4_ * fVar202;
          auVar121._0_8_ = CONCAT44(fVar202,fVar201);
          auVar121._8_4_ = auVar166._8_4_ + auVar101._8_4_ * fVar203;
          auVar121._12_4_ = auVar166._12_4_ + auVar101._12_4_ * fVar204;
          fVar203 = auVar101._0_4_ * 3.0;
          fVar204 = auVar101._4_4_ * 3.0;
          auVar167._0_8_ = CONCAT44(fVar204,fVar203);
          auVar167._8_4_ = auVar101._8_4_ * 3.0;
          auVar167._12_4_ = auVar101._12_4_ * 3.0;
          auVar262._8_8_ = auVar121._0_8_;
          auVar262._0_8_ = auVar121._0_8_;
          auVar101 = vshufpd_avx(auVar121,auVar121,3);
          auVar22 = vshufps_avx(auVar83,auVar83,0x55);
          auVar142 = vsubps_avx(auVar101,auVar262);
          auVar263._0_4_ = auVar22._0_4_ * auVar142._0_4_ + fVar201;
          auVar263._4_4_ = auVar22._4_4_ * auVar142._4_4_ + fVar202;
          auVar263._8_4_ = auVar22._8_4_ * auVar142._8_4_ + fVar201;
          auVar263._12_4_ = auVar22._12_4_ * auVar142._12_4_ + fVar202;
          auVar304._8_8_ = auVar167._0_8_;
          auVar304._0_8_ = auVar167._0_8_;
          auVar101 = vshufpd_avx(auVar167,auVar167,1);
          auVar101 = vsubps_avx(auVar101,auVar304);
          auVar168._0_4_ = fVar203 + auVar22._0_4_ * auVar101._0_4_;
          auVar168._4_4_ = fVar204 + auVar22._4_4_ * auVar101._4_4_;
          auVar168._8_4_ = fVar203 + auVar22._8_4_ * auVar101._8_4_;
          auVar168._12_4_ = fVar204 + auVar22._12_4_ * auVar101._12_4_;
          auVar22 = vmovshdup_avx(auVar168);
          auVar305._0_8_ = auVar22._0_8_ ^ 0x8000000080000000;
          auVar305._8_4_ = auVar22._8_4_ ^ 0x80000000;
          auVar305._12_4_ = auVar22._12_4_ ^ 0x80000000;
          auVar196 = vmovshdup_avx(auVar142);
          auVar101 = vunpcklps_avx(auVar196,auVar305);
          auVar143 = vshufps_avx(auVar101,auVar305,4);
          auVar122._0_8_ = auVar142._0_8_ ^ 0x8000000080000000;
          auVar122._8_4_ = -auVar142._8_4_;
          auVar122._12_4_ = -auVar142._12_4_;
          auVar101 = vmovlhps_avx(auVar122,auVar168);
          auVar100 = vshufps_avx(auVar101,auVar168,8);
          auVar101 = ZEXT416((uint)(auVar196._0_4_ * auVar168._0_4_ - auVar22._0_4_ * auVar142._0_4_
                                   ));
          auVar22 = vshufps_avx(auVar101,auVar101,0);
          auVar101 = vdivps_avx(auVar143,auVar22);
          auVar22 = vdivps_avx(auVar100,auVar22);
          auVar100 = vinsertps_avx(auVar193,auVar268,0x1c);
          auVar142 = vinsertps_avx(auVar212,auVar277,0x1c);
          auVar82 = vinsertps_avx(auVar268,auVar193,0x4c);
          auVar118 = vinsertps_avx(auVar277,auVar212,0x4c);
          auVar196 = vmovsldup_avx(auVar101);
          auVar278._0_4_ = auVar196._0_4_ * auVar100._0_4_;
          auVar278._4_4_ = auVar196._4_4_ * auVar100._4_4_;
          auVar278._8_4_ = auVar196._8_4_ * auVar100._8_4_;
          auVar278._12_4_ = auVar196._12_4_ * auVar100._12_4_;
          auVar269._0_4_ = auVar196._0_4_ * auVar142._0_4_;
          auVar269._4_4_ = auVar196._4_4_ * auVar142._4_4_;
          auVar269._8_4_ = auVar196._8_4_ * auVar142._8_4_;
          auVar269._12_4_ = auVar196._12_4_ * auVar142._12_4_;
          auVar143 = vminps_avx(auVar278,auVar269);
          auVar196 = vmaxps_avx(auVar269,auVar278);
          auVar241 = vmovsldup_avx(auVar22);
          auVar322._0_4_ = auVar241._0_4_ * auVar82._0_4_;
          auVar322._4_4_ = auVar241._4_4_ * auVar82._4_4_;
          auVar322._8_4_ = auVar241._8_4_ * auVar82._8_4_;
          auVar322._12_4_ = auVar241._12_4_ * auVar82._12_4_;
          auVar270._0_4_ = auVar241._0_4_ * auVar118._0_4_;
          auVar270._4_4_ = auVar241._4_4_ * auVar118._4_4_;
          auVar270._8_4_ = auVar241._8_4_ * auVar118._8_4_;
          auVar270._12_4_ = auVar241._12_4_ * auVar118._12_4_;
          auVar241 = vminps_avx(auVar322,auVar270);
          auVar103._0_4_ = auVar143._0_4_ + auVar241._0_4_;
          auVar103._4_4_ = auVar143._4_4_ + auVar241._4_4_;
          auVar103._8_4_ = auVar143._8_4_ + auVar241._8_4_;
          auVar103._12_4_ = auVar143._12_4_ + auVar241._12_4_;
          auVar143 = vmaxps_avx(auVar270,auVar322);
          auVar241 = vsubps_avx(auVar229,auVar83);
          auVar7 = vsubps_avx(auVar245,auVar83);
          auVar246._0_4_ = auVar196._0_4_ + auVar143._0_4_;
          auVar246._4_4_ = auVar196._4_4_ + auVar143._4_4_;
          auVar246._8_4_ = auVar196._8_4_ + auVar143._8_4_;
          auVar246._12_4_ = auVar196._12_4_ + auVar143._12_4_;
          auVar279._8_8_ = 0x3f800000;
          auVar279._0_8_ = 0x3f800000;
          auVar196 = vsubps_avx(auVar279,auVar246);
          auVar143 = vsubps_avx(auVar279,auVar103);
          fVar156 = auVar241._0_4_;
          auVar280._0_4_ = fVar156 * auVar196._0_4_;
          fVar157 = auVar241._4_4_;
          auVar280._4_4_ = fVar157 * auVar196._4_4_;
          fVar158 = auVar241._8_4_;
          auVar280._8_4_ = fVar158 * auVar196._8_4_;
          fVar161 = auVar241._12_4_;
          auVar280._12_4_ = fVar161 * auVar196._12_4_;
          fVar203 = auVar7._0_4_;
          auVar247._0_4_ = auVar196._0_4_ * fVar203;
          fVar204 = auVar7._4_4_;
          auVar247._4_4_ = auVar196._4_4_ * fVar204;
          fVar131 = auVar7._8_4_;
          auVar247._8_4_ = auVar196._8_4_ * fVar131;
          fVar155 = auVar7._12_4_;
          auVar247._12_4_ = auVar196._12_4_ * fVar155;
          auVar312._0_4_ = fVar156 * auVar143._0_4_;
          auVar312._4_4_ = fVar157 * auVar143._4_4_;
          auVar312._8_4_ = fVar158 * auVar143._8_4_;
          auVar312._12_4_ = fVar161 * auVar143._12_4_;
          auVar104._0_4_ = fVar203 * auVar143._0_4_;
          auVar104._4_4_ = fVar204 * auVar143._4_4_;
          auVar104._8_4_ = fVar131 * auVar143._8_4_;
          auVar104._12_4_ = fVar155 * auVar143._12_4_;
          auVar196 = vminps_avx(auVar280,auVar312);
          auVar143 = vminps_avx(auVar247,auVar104);
          auVar241 = vminps_avx(auVar196,auVar143);
          auVar196 = vmaxps_avx(auVar312,auVar280);
          auVar143 = vmaxps_avx(auVar104,auVar247);
          auVar7 = vshufps_avx(auVar83,auVar83,0x54);
          auVar143 = vmaxps_avx(auVar143,auVar196);
          auVar227 = vshufps_avx(auVar263,auVar263,0);
          auVar76 = vshufps_avx(auVar263,auVar263,0x55);
          auVar196 = vhaddps_avx(auVar241,auVar241);
          auVar143 = vhaddps_avx(auVar143,auVar143);
          auVar248._0_4_ = auVar227._0_4_ * auVar101._0_4_ + auVar76._0_4_ * auVar22._0_4_;
          auVar248._4_4_ = auVar227._4_4_ * auVar101._4_4_ + auVar76._4_4_ * auVar22._4_4_;
          auVar248._8_4_ = auVar227._8_4_ * auVar101._8_4_ + auVar76._8_4_ * auVar22._8_4_;
          auVar248._12_4_ = auVar227._12_4_ * auVar101._12_4_ + auVar76._12_4_ * auVar22._12_4_;
          auVar241 = vsubps_avx(auVar7,auVar248);
          fVar201 = auVar241._0_4_ + auVar196._0_4_;
          fVar202 = auVar241._0_4_ + auVar143._0_4_;
          auVar196 = vmaxss_avx(ZEXT416((uint)fVar200),ZEXT416((uint)fVar201));
          auVar143 = vminss_avx(ZEXT416((uint)fVar202),ZEXT416((uint)fVar182));
          if (auVar196._0_4_ <= auVar143._0_4_) {
            auVar196 = vmovshdup_avx(auVar101);
            auVar139._0_4_ = auVar100._0_4_ * auVar196._0_4_;
            auVar139._4_4_ = auVar100._4_4_ * auVar196._4_4_;
            auVar139._8_4_ = auVar100._8_4_ * auVar196._8_4_;
            auVar139._12_4_ = auVar100._12_4_ * auVar196._12_4_;
            auVar105._0_4_ = auVar142._0_4_ * auVar196._0_4_;
            auVar105._4_4_ = auVar142._4_4_ * auVar196._4_4_;
            auVar105._8_4_ = auVar142._8_4_ * auVar196._8_4_;
            auVar105._12_4_ = auVar142._12_4_ * auVar196._12_4_;
            auVar143 = vminps_avx(auVar139,auVar105);
            auVar196 = vmaxps_avx(auVar105,auVar139);
            auVar100 = vmovshdup_avx(auVar22);
            auVar194._0_4_ = auVar100._0_4_ * auVar82._0_4_;
            auVar194._4_4_ = auVar100._4_4_ * auVar82._4_4_;
            auVar194._8_4_ = auVar100._8_4_ * auVar82._8_4_;
            auVar194._12_4_ = auVar100._12_4_ * auVar82._12_4_;
            auVar140._0_4_ = auVar100._0_4_ * auVar118._0_4_;
            auVar140._4_4_ = auVar100._4_4_ * auVar118._4_4_;
            auVar140._8_4_ = auVar100._8_4_ * auVar118._8_4_;
            auVar140._12_4_ = auVar100._12_4_ * auVar118._12_4_;
            auVar100 = vminps_avx(auVar194,auVar140);
            auVar213._0_4_ = auVar143._0_4_ + auVar100._0_4_;
            auVar213._4_4_ = auVar143._4_4_ + auVar100._4_4_;
            auVar213._8_4_ = auVar143._8_4_ + auVar100._8_4_;
            auVar213._12_4_ = auVar143._12_4_ + auVar100._12_4_;
            auVar143 = vmaxps_avx(auVar140,auVar194);
            auVar106._0_4_ = auVar196._0_4_ + auVar143._0_4_;
            auVar106._4_4_ = auVar196._4_4_ + auVar143._4_4_;
            auVar106._8_4_ = auVar196._8_4_ + auVar143._8_4_;
            auVar106._12_4_ = auVar196._12_4_ + auVar143._12_4_;
            auVar196 = vsubps_avx(_local_3d8,auVar106);
            auVar143 = vsubps_avx(_local_3d8,auVar213);
            auVar195._0_4_ = fVar156 * auVar196._0_4_;
            auVar195._4_4_ = fVar157 * auVar196._4_4_;
            auVar195._8_4_ = fVar158 * auVar196._8_4_;
            auVar195._12_4_ = fVar161 * auVar196._12_4_;
            auVar214._0_4_ = fVar156 * auVar143._0_4_;
            auVar214._4_4_ = fVar157 * auVar143._4_4_;
            auVar214._8_4_ = fVar158 * auVar143._8_4_;
            auVar214._12_4_ = fVar161 * auVar143._12_4_;
            auVar107._0_4_ = fVar203 * auVar196._0_4_;
            auVar107._4_4_ = fVar204 * auVar196._4_4_;
            auVar107._8_4_ = fVar131 * auVar196._8_4_;
            auVar107._12_4_ = fVar155 * auVar196._12_4_;
            auVar141._0_4_ = fVar203 * auVar143._0_4_;
            auVar141._4_4_ = fVar204 * auVar143._4_4_;
            auVar141._8_4_ = fVar131 * auVar143._8_4_;
            auVar141._12_4_ = fVar155 * auVar143._12_4_;
            auVar196 = vminps_avx(auVar195,auVar214);
            auVar143 = vminps_avx(auVar107,auVar141);
            auVar196 = vminps_avx(auVar196,auVar143);
            auVar143 = vmaxps_avx(auVar214,auVar195);
            auVar100 = vmaxps_avx(auVar141,auVar107);
            auVar196 = vhaddps_avx(auVar196,auVar196);
            auVar143 = vmaxps_avx(auVar100,auVar143);
            auVar143 = vhaddps_avx(auVar143,auVar143);
            auVar100 = vmovshdup_avx(auVar241);
            auVar142 = ZEXT416((uint)(auVar100._0_4_ + auVar196._0_4_));
            auVar196 = vmaxss_avx(local_488,auVar142);
            auVar100 = ZEXT416((uint)(auVar100._0_4_ + auVar143._0_4_));
            auVar143 = vminss_avx(auVar100,_local_468);
            if (auVar196._0_4_ <= auVar143._0_4_) {
              uVar69 = 0;
              auVar323._8_4_ = 0x3f800000;
              auVar323._0_8_ = &DAT_3f8000003f800000;
              auVar323._12_4_ = 0x3f800000;
              auVar325 = ZEXT1664(auVar323);
              if (fVar201 <= fVar200) {
                auVar249._8_4_ = 0x7fffffff;
                auVar249._0_8_ = 0x7fffffff7fffffff;
                auVar249._12_4_ = 0x7fffffff;
              }
              else {
                auVar249._8_4_ = 0x7fffffff;
                auVar249._0_8_ = 0x7fffffff7fffffff;
                auVar249._12_4_ = 0x7fffffff;
                if (fVar202 < fVar182) {
                  auVar196 = vcmpps_avx(auVar100,_local_468,1);
                  auVar143 = vcmpps_avx(local_488,auVar142,1);
                  auVar196 = vandps_avx(auVar143,auVar196);
                  uVar69 = auVar196._0_4_;
                }
              }
              if (((uint)uVar73 < 4 && 0.001 <= fVar199) && (uVar69 & 1) == 0) {
                bVar61 = false;
              }
              else {
                lVar72 = 200;
                do {
                  fVar199 = auVar241._0_4_;
                  fVar182 = 1.0 - fVar199;
                  auVar196 = ZEXT416((uint)(fVar182 * fVar182 * fVar182));
                  auVar196 = vshufps_avx(auVar196,auVar196,0);
                  auVar143 = ZEXT416((uint)(fVar199 * 3.0 * fVar182 * fVar182));
                  auVar143 = vshufps_avx(auVar143,auVar143,0);
                  auVar100 = ZEXT416((uint)(fVar182 * fVar199 * fVar199 * 3.0));
                  auVar100 = vshufps_avx(auVar100,auVar100,0);
                  auVar142 = ZEXT416((uint)(fVar199 * fVar199 * fVar199));
                  auVar142 = vshufps_avx(auVar142,auVar142,0);
                  fVar182 = (float)local_2e8._0_4_ * auVar196._0_4_ +
                            (float)local_2f8._0_4_ * auVar143._0_4_ +
                            auVar142._0_4_ * (float)local_408._0_4_ +
                            (float)local_308._0_4_ * auVar100._0_4_;
                  fVar199 = (float)local_2e8._4_4_ * auVar196._4_4_ +
                            (float)local_2f8._4_4_ * auVar143._4_4_ +
                            auVar142._4_4_ * (float)local_408._4_4_ +
                            (float)local_308._4_4_ * auVar100._4_4_;
                  auVar108._0_8_ = CONCAT44(fVar199,fVar182);
                  auVar108._8_4_ =
                       fStack_2e0 * auVar196._8_4_ +
                       fStack_2f0 * auVar143._8_4_ +
                       auVar142._8_4_ * fStack_400 + fStack_300 * auVar100._8_4_;
                  auVar108._12_4_ =
                       fStack_2dc * auVar196._12_4_ +
                       fStack_2ec * auVar143._12_4_ +
                       auVar142._12_4_ * fStack_3fc + fStack_2fc * auVar100._12_4_;
                  auVar144._8_8_ = auVar108._0_8_;
                  auVar144._0_8_ = auVar108._0_8_;
                  auVar143 = vshufpd_avx(auVar108,auVar108,1);
                  auVar196 = vmovshdup_avx(auVar241);
                  auVar143 = vsubps_avx(auVar143,auVar144);
                  auVar109._0_4_ = auVar196._0_4_ * auVar143._0_4_ + fVar182;
                  auVar109._4_4_ = auVar196._4_4_ * auVar143._4_4_ + fVar199;
                  auVar109._8_4_ = auVar196._8_4_ * auVar143._8_4_ + fVar182;
                  auVar109._12_4_ = auVar196._12_4_ * auVar143._12_4_ + fVar199;
                  auVar196 = vshufps_avx(auVar109,auVar109,0);
                  auVar143 = vshufps_avx(auVar109,auVar109,0x55);
                  auVar145._0_4_ = auVar101._0_4_ * auVar196._0_4_ + auVar22._0_4_ * auVar143._0_4_;
                  auVar145._4_4_ = auVar101._4_4_ * auVar196._4_4_ + auVar22._4_4_ * auVar143._4_4_;
                  auVar145._8_4_ = auVar101._8_4_ * auVar196._8_4_ + auVar22._8_4_ * auVar143._8_4_;
                  auVar145._12_4_ =
                       auVar101._12_4_ * auVar196._12_4_ + auVar22._12_4_ * auVar143._12_4_;
                  auVar241 = vsubps_avx(auVar241,auVar145);
                  auVar196 = vandps_avx(auVar249,auVar109);
                  auVar143 = vshufps_avx(auVar196,auVar196,0xf5);
                  auVar196 = vmaxss_avx(auVar143,auVar196);
                  if (auVar196._0_4_ < (float)local_2d8._0_4_) {
                    fVar182 = auVar241._0_4_;
                    if ((0.0 <= fVar182) && (fVar182 <= 1.0)) {
                      auVar101 = vmovshdup_avx(auVar241);
                      fVar199 = auVar101._0_4_;
                      if ((0.0 <= fVar199) && (fVar199 <= 1.0)) {
                        auVar101 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2]),
                                                 ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]),
                                                 0x1c);
                        auVar118 = vinsertps_avx(auVar101,ZEXT416((uint)(pre->ray_space).vz.field_0.
                                                                        m128[2]),0x28);
                        aVar6 = (ray->org).field_0;
                        auVar101 = vsubps_avx(_local_368,(undefined1  [16])aVar6);
                        auVar101 = vdpps_avx(auVar101,auVar118,0x7f);
                        auVar22 = vsubps_avx(_local_398,(undefined1  [16])aVar6);
                        auVar22 = vdpps_avx(auVar22,auVar118,0x7f);
                        auVar196 = vsubps_avx(_local_3a8,(undefined1  [16])aVar6);
                        auVar196 = vdpps_avx(auVar196,auVar118,0x7f);
                        auVar143 = vsubps_avx(_local_388,(undefined1  [16])aVar6);
                        auVar143 = vdpps_avx(auVar143,auVar118,0x7f);
                        auVar100 = vsubps_avx(_local_378,(undefined1  [16])aVar6);
                        auVar100 = vdpps_avx(auVar100,auVar118,0x7f);
                        auVar142 = vsubps_avx(_local_3b8,(undefined1  [16])aVar6);
                        auVar142 = vdpps_avx(auVar142,auVar118,0x7f);
                        auVar82 = vsubps_avx(_local_288,(undefined1  [16])aVar6);
                        auVar82 = vdpps_avx(auVar82,auVar118,0x7f);
                        auVar67._4_4_ = fStack_3e4;
                        auVar67._0_4_ = local_3e8;
                        auVar67._8_4_ = fStack_3e0;
                        auVar67._12_4_ = fStack_3dc;
                        auVar7 = vsubps_avx(auVar67,(undefined1  [16])aVar6);
                        auVar118 = vdpps_avx(auVar7,auVar118,0x7f);
                        fVar131 = 1.0 - fVar199;
                        fVar155 = 1.0 - fVar182;
                        fVar201 = auVar241._4_4_;
                        fVar202 = auVar241._8_4_;
                        fVar203 = auVar241._12_4_;
                        fVar204 = fVar155 * fVar182 * fVar182 * 3.0;
                        auVar197._0_4_ = fVar182 * fVar182 * fVar182;
                        auVar197._4_4_ = fVar201 * fVar201 * fVar201;
                        auVar197._8_4_ = fVar202 * fVar202 * fVar202;
                        auVar197._12_4_ = fVar203 * fVar203 * fVar203;
                        fVar201 = fVar182 * 3.0 * fVar155 * fVar155;
                        fVar202 = fVar155 * fVar155 * fVar155;
                        fVar182 = (fVar131 * auVar101._0_4_ + auVar100._0_4_ * fVar199) * fVar202 +
                                  fVar201 * (auVar142._0_4_ * fVar199 + fVar131 * auVar22._0_4_) +
                                  fVar204 * (auVar82._0_4_ * fVar199 + fVar131 * auVar196._0_4_) +
                                  auVar197._0_4_ *
                                  (fVar131 * auVar143._0_4_ + fVar199 * auVar118._0_4_);
                        if (((ray->org).field_0.m128[3] <= fVar182) && (fVar182 <= ray->tfar)) {
                          pGVar9 = (context->scene->geometries).items[local_3f0].ptr;
                          auVar101 = ZEXT416((uint)fVar200);
                          if ((pGVar9->mask & ray->mask) == 0) {
                            bVar68 = 0;
                          }
                          else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                  (bVar68 = 1, pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0))
                          {
                            local_468._0_4_ = ray->tfar;
                            auVar101 = vshufps_avx(auVar241,auVar241,0x55);
                            auVar240 = vsubps_avx(auVar323,auVar101);
                            fVar199 = auVar101._0_4_;
                            fVar200 = auVar101._4_4_;
                            fVar203 = auVar101._8_4_;
                            fVar131 = auVar101._12_4_;
                            fVar156 = auVar240._0_4_;
                            fVar157 = auVar240._4_4_;
                            fVar158 = auVar240._8_4_;
                            fVar161 = auVar240._12_4_;
                            auVar264._0_4_ =
                                 fVar199 * (float)local_378._0_4_ + fVar156 * (float)local_368._0_4_
                            ;
                            auVar264._4_4_ =
                                 fVar200 * (float)local_378._4_4_ + fVar157 * (float)local_368._4_4_
                            ;
                            auVar264._8_4_ = fVar203 * fStack_370 + fVar158 * fStack_360;
                            auVar264._12_4_ = fVar131 * fStack_36c + fVar161 * fStack_35c;
                            auVar271._0_4_ =
                                 fVar199 * (float)local_3b8._0_4_ + fVar156 * (float)local_398._0_4_
                            ;
                            auVar271._4_4_ =
                                 fVar200 * (float)local_3b8._4_4_ + fVar157 * (float)local_398._4_4_
                            ;
                            auVar271._8_4_ = fVar203 * fStack_3b0 + fVar158 * fStack_390;
                            auVar271._12_4_ = fVar131 * fStack_3ac + fVar161 * fStack_38c;
                            auVar281._0_4_ =
                                 fVar199 * (float)local_288._0_4_ + fVar156 * (float)local_3a8._0_4_
                            ;
                            auVar281._4_4_ =
                                 fVar200 * (float)local_288._4_4_ + fVar157 * (float)local_3a8._4_4_
                            ;
                            auVar281._8_4_ = fVar203 * fStack_280 + fVar158 * fStack_3a0;
                            auVar281._12_4_ = fVar131 * fStack_27c + fVar161 * fStack_39c;
                            auVar230._0_4_ = fVar156 * (float)local_388._0_4_ + fVar199 * local_3e8;
                            auVar230._4_4_ = fVar157 * (float)local_388._4_4_ + fVar200 * fStack_3e4
                            ;
                            auVar230._8_4_ = fVar158 * fStack_380 + fVar203 * fStack_3e0;
                            auVar230._12_4_ = fVar161 * fStack_37c + fVar131 * fStack_3dc;
                            auVar196 = vsubps_avx(auVar271,auVar264);
                            auVar143 = vsubps_avx(auVar281,auVar271);
                            auVar100 = vsubps_avx(auVar230,auVar281);
                            auVar101 = vshufps_avx(auVar241,auVar241,0);
                            fVar156 = auVar101._0_4_;
                            fVar157 = auVar101._4_4_;
                            fVar158 = auVar101._8_4_;
                            fVar161 = auVar101._12_4_;
                            auVar101 = vshufps_avx(ZEXT416((uint)fVar155),ZEXT416((uint)fVar155),0);
                            fVar199 = auVar101._0_4_;
                            fVar200 = auVar101._4_4_;
                            fVar203 = auVar101._8_4_;
                            fVar131 = auVar101._12_4_;
                            auVar101 = vshufps_avx(auVar197,auVar197,0);
                            auVar240 = vshufps_avx(ZEXT416((uint)fVar204),ZEXT416((uint)fVar204),0);
                            auVar22 = vshufps_avx(ZEXT416((uint)fVar201),ZEXT416((uint)fVar201),0);
                            auVar169._0_4_ =
                                 ((auVar196._0_4_ * fVar199 + fVar156 * auVar143._0_4_) * fVar199 +
                                 fVar156 * (auVar143._0_4_ * fVar199 + fVar156 * auVar100._0_4_)) *
                                 3.0;
                            auVar169._4_4_ =
                                 ((auVar196._4_4_ * fVar200 + fVar157 * auVar143._4_4_) * fVar200 +
                                 fVar157 * (auVar143._4_4_ * fVar200 + fVar157 * auVar100._4_4_)) *
                                 3.0;
                            auVar169._8_4_ =
                                 ((auVar196._8_4_ * fVar203 + fVar158 * auVar143._8_4_) * fVar203 +
                                 fVar158 * (auVar143._8_4_ * fVar203 + fVar158 * auVar100._8_4_)) *
                                 3.0;
                            auVar169._12_4_ =
                                 ((auVar196._12_4_ * fVar131 + fVar161 * auVar143._12_4_) * fVar131
                                 + fVar161 * (auVar143._12_4_ * fVar131 + fVar161 * auVar100._12_4_)
                                 ) * 3.0;
                            auVar196 = vshufps_avx(ZEXT416((uint)fVar202),ZEXT416((uint)fVar202),0);
                            auVar123._0_4_ =
                                 auVar196._0_4_ * (float)local_208._0_4_ +
                                 auVar22._0_4_ * (float)local_218._0_4_ +
                                 auVar101._0_4_ * (float)local_238._0_4_ +
                                 auVar240._0_4_ * (float)local_228._0_4_;
                            auVar123._4_4_ =
                                 auVar196._4_4_ * (float)local_208._4_4_ +
                                 auVar22._4_4_ * (float)local_218._4_4_ +
                                 auVar101._4_4_ * (float)local_238._4_4_ +
                                 auVar240._4_4_ * (float)local_228._4_4_;
                            auVar123._8_4_ =
                                 auVar196._8_4_ * fStack_200 +
                                 auVar22._8_4_ * fStack_210 +
                                 auVar101._8_4_ * fStack_230 + auVar240._8_4_ * fStack_220;
                            auVar123._12_4_ =
                                 auVar196._12_4_ * fStack_1fc +
                                 auVar22._12_4_ * fStack_20c +
                                 auVar101._12_4_ * fStack_22c + auVar240._12_4_ * fStack_21c;
                            auVar101 = vshufps_avx(auVar169,auVar169,0xc9);
                            auVar146._0_4_ = auVar123._0_4_ * auVar101._0_4_;
                            auVar146._4_4_ = auVar123._4_4_ * auVar101._4_4_;
                            auVar146._8_4_ = auVar123._8_4_ * auVar101._8_4_;
                            auVar146._12_4_ = auVar123._12_4_ * auVar101._12_4_;
                            auVar101 = vshufps_avx(auVar123,auVar123,0xc9);
                            auVar124._0_4_ = auVar169._0_4_ * auVar101._0_4_;
                            auVar124._4_4_ = auVar169._4_4_ * auVar101._4_4_;
                            auVar124._8_4_ = auVar169._8_4_ * auVar101._8_4_;
                            auVar124._12_4_ = auVar169._12_4_ * auVar101._12_4_;
                            auVar240 = vsubps_avx(auVar124,auVar146);
                            auVar101 = vshufps_avx(auVar240,auVar240,0xe9);
                            local_268 = vmovlps_avx(auVar101);
                            local_260 = auVar240._0_4_;
                            local_25c = vmovlps_avx(auVar241);
                            local_254 = (int)local_2c8;
                            local_250 = (int)local_3f0;
                            local_24c = context->user->instID[0];
                            local_248 = context->user->instPrimID[0];
                            ray->tfar = fVar182;
                            local_46c = -1;
                            local_2b8.valid = &local_46c;
                            local_2b8.geometryUserPtr = pGVar9->userPtr;
                            local_2b8.context = context->user;
                            local_2b8.hit = (RTCHitN *)&local_268;
                            local_2b8.N = 1;
                            local_2b8.ray = (RTCRayN *)ray;
                            if (pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0116b93a:
                              p_Var10 = context->args->filter;
                              fVar182 = (float)local_468._0_4_;
                              if (p_Var10 != (RTCFilterFunctionN)0x0) {
                                if (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                   (((pGVar9->field_8).field_0x2 & 0x40) != 0)) {
                                  (*p_Var10)(&local_2b8);
                                  auVar325 = ZEXT1664(CONCAT412(0x3f800000,
                                                                CONCAT48(0x3f800000,
                                                                         &DAT_3f8000003f800000)));
                                }
                                fVar182 = (float)local_468._0_4_;
                                if (*local_2b8.valid == 0) {
                                  bVar68 = 0;
                                  goto LAB_0116ba3c;
                                }
                              }
                              bVar68 = 1;
                            }
                            else {
                              stack0xfffffffffffffcdc = auVar15._4_28_;
                              local_328._0_4_ = (int)uVar74;
                              (*pGVar9->occlusionFilterN)(&local_2b8);
                              uVar74 = (ulong)(uint)local_328._0_4_;
                              auVar325 = ZEXT1664(CONCAT412(0x3f800000,
                                                            CONCAT48(0x3f800000,
                                                                     &DAT_3f8000003f800000)));
                              if (*local_2b8.valid != 0) goto LAB_0116b93a;
                              bVar68 = 0;
                              fVar182 = (float)local_468._0_4_;
                            }
LAB_0116ba3c:
                            auVar101 = _local_448;
                            if (bVar68 == 0) {
                              ray->tfar = fVar182;
                            }
                          }
                          _local_448 = auVar101;
                          uVar74 = CONCAT71((int7)(uVar74 >> 8),(byte)uVar74 | bVar68);
                          auVar240 = _local_448;
                        }
                      }
                    }
                    break;
                  }
                  lVar72 = lVar72 + -1;
                } while (lVar72 != 0);
              }
              goto LAB_0116b6b7;
            }
          }
          goto LAB_0116b9f4;
        }
      }
LAB_0116b6b7:
      _local_448 = auVar240;
      auVar101 = _local_448;
    } while (bVar61);
    _local_448 = auVar101;
    local_1f8 = vinsertps_avx(_local_448,ZEXT416((uint)local_428._0_4_),0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }